

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

int opengv::absolute_pose::modules::gpnp4::init(EVP_PKEY_CTX *ctx)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_R8;
  double *in_R9;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1103 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1110 [16];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 auVar1113 [16];
  undefined1 auVar1114 [16];
  undefined1 auVar1115 [16];
  undefined1 auVar1116 [16];
  undefined1 auVar1117 [16];
  undefined1 auVar1118 [16];
  undefined1 auVar1119 [16];
  undefined1 auVar1120 [16];
  undefined1 auVar1121 [16];
  undefined1 auVar1122 [16];
  undefined1 auVar1123 [16];
  undefined1 auVar1124 [16];
  undefined1 auVar1125 [16];
  undefined1 auVar1126 [16];
  undefined1 auVar1127 [16];
  undefined1 auVar1128 [16];
  undefined1 auVar1129 [16];
  undefined1 auVar1130 [16];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar1153 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1155 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1157 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1159 [16];
  undefined1 auVar1160 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1168 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [16];
  undefined1 auVar1172 [16];
  undefined1 auVar1173 [16];
  undefined1 auVar1174 [16];
  undefined1 auVar1175 [16];
  undefined1 auVar1176 [16];
  undefined1 auVar1177 [16];
  undefined1 auVar1178 [16];
  undefined1 auVar1179 [16];
  undefined1 auVar1180 [16];
  undefined1 auVar1181 [16];
  undefined1 auVar1182 [16];
  undefined1 auVar1183 [16];
  undefined1 auVar1184 [16];
  undefined1 auVar1185 [16];
  undefined1 auVar1186 [16];
  undefined1 auVar1187 [16];
  undefined1 auVar1188 [16];
  undefined1 auVar1189 [16];
  undefined1 auVar1190 [16];
  undefined1 auVar1191 [16];
  undefined1 auVar1192 [16];
  undefined1 (*in_stack_00000008) [16];
  undefined1 (*in_stack_00000010) [16];
  undefined1 (*in_stack_00000018) [16];
  undefined1 (*in_stack_00000020) [16];
  
  auVar14 = *in_stack_00000008;
  auVar13 = *in_stack_00000010;
  auVar15 = vsubpd_avx(auVar14,auVar13);
  dVar1 = *(double *)in_stack_00000008[1];
  dVar2 = *(double *)in_stack_00000010[1];
  auVar16 = vsubpd_avx(auVar14,*in_stack_00000018);
  dVar9 = dVar1 - *(double *)in_stack_00000018[1];
  auVar17 = vsubpd_avx(auVar14,*in_stack_00000020);
  dVar10 = dVar1 - *(double *)in_stack_00000020[1];
  auVar18 = vsubpd_avx(auVar13,*in_stack_00000018);
  dVar11 = dVar2 - *(double *)in_stack_00000018[1];
  auVar13 = vsubpd_avx(auVar13,*in_stack_00000020);
  dVar12 = dVar2 - *(double *)in_stack_00000020[1];
  dVar3 = *in_R9;
  dVar4 = in_R9[1];
  dVar5 = in_R9[3];
  auVar844._8_8_ = 0;
  auVar844._0_8_ = dVar5;
  dVar6 = in_R9[4];
  auVar677._8_8_ = 0;
  auVar677._0_8_ = dVar3 * -2.0;
  auVar1028._8_8_ = 0;
  auVar1028._0_8_ = dVar4 * -2.0 * dVar6;
  auVar14 = vfmadd231sd_fma(auVar1028,auVar844,auVar677);
  dVar7 = in_R9[2];
  dVar8 = in_R9[5];
  auVar1103._8_8_ = 0;
  auVar1103._0_8_ = dVar8;
  auVar1145._8_8_ = 0;
  auVar1145._0_8_ = dVar7 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1145,auVar1103,auVar14);
  *(double *)(ctx + 0x1130) =
       dVar8 * dVar8 +
       dVar7 * dVar7 + dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + auVar14._0_8_ + dVar3 * dVar3
  ;
  dVar3 = *in_R8;
  dVar4 = in_R8[1];
  auVar845._8_8_ = 0;
  auVar845._0_8_ = in_R9[3];
  auVar945._8_8_ = 0;
  auVar945._0_8_ = *in_R9;
  auVar1029._8_8_ = 0;
  auVar1029._0_8_ = in_R9[1];
  auVar378._8_8_ = 0;
  auVar378._0_8_ = in_R9[3] * dVar3 * -2.0;
  auVar678._8_8_ = 0;
  auVar678._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar378,auVar945,auVar678);
  dVar3 = in_R8[3];
  auVar679._8_8_ = 0;
  auVar679._0_8_ = dVar3;
  auVar946._8_8_ = 0;
  auVar946._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar946,auVar679,auVar14);
  auVar379._8_8_ = 0;
  auVar379._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar379,auVar845,auVar14);
  auVar680._8_8_ = 0;
  auVar680._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar680,auVar1029,auVar14);
  auVar380._8_8_ = 0;
  auVar380._0_8_ = in_R9[4];
  auVar540._8_8_ = 0;
  auVar540._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar540,auVar380,auVar14);
  dVar3 = in_R8[4];
  auVar681._8_8_ = 0;
  auVar681._0_8_ = dVar3;
  auVar846._8_8_ = 0;
  auVar846._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar846,auVar681,auVar14);
  auVar541._8_8_ = 0;
  auVar541._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar541,auVar380,auVar14);
  dVar3 = in_R8[2];
  auVar847._8_8_ = 0;
  auVar847._0_8_ = in_R9[2];
  auVar682._8_8_ = 0;
  auVar682._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar682,auVar847,auVar14);
  auVar542._8_8_ = 0;
  auVar542._0_8_ = in_R9[5];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar381,auVar542,auVar14);
  dVar3 = in_R8[5];
  auVar683._8_8_ = 0;
  auVar683._0_8_ = dVar3;
  auVar848._8_8_ = 0;
  auVar848._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar848,auVar683,auVar14);
  auVar382._8_8_ = 0;
  auVar382._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar382,auVar542,auVar14);
  *(long *)(ctx + 0x11f8) = auVar14._0_8_;
  dVar3 = *in_R8;
  dVar4 = in_R8[1];
  dVar5 = in_R8[3];
  auVar849._8_8_ = 0;
  auVar849._0_8_ = dVar5;
  dVar6 = in_R8[4];
  auVar684._8_8_ = 0;
  auVar684._0_8_ = dVar3 * -2.0;
  auVar1030._8_8_ = 0;
  auVar1030._0_8_ = dVar4 * -2.0 * dVar6;
  auVar14 = vfmadd231sd_fma(auVar1030,auVar849,auVar684);
  dVar7 = in_R8[2];
  dVar8 = in_R8[5];
  auVar1104._8_8_ = 0;
  auVar1104._0_8_ = dVar8;
  auVar1146._8_8_ = 0;
  auVar1146._0_8_ = dVar7 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1146,auVar1104,auVar14);
  *(double *)(ctx + 0x12c0) =
       dVar8 * dVar8 +
       dVar7 * dVar7 + dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + auVar14._0_8_ + dVar3 * dVar3
  ;
  dVar3 = in_RCX[2];
  auVar685._8_8_ = 0;
  auVar685._0_8_ = in_R9[2];
  dVar4 = *in_RCX;
  dVar5 = in_RCX[1];
  auVar1147._8_8_ = 0;
  auVar1147._0_8_ = in_R9[1];
  auVar543._8_8_ = 0;
  auVar543._0_8_ = dVar3 + dVar3;
  auVar1031._8_8_ = 0;
  auVar1031._0_8_ = (dVar4 + dVar4) * *in_R9;
  auVar14 = vfmadd231sd_fma(auVar1031,auVar685,auVar543);
  auVar544._8_8_ = 0;
  auVar544._0_8_ = in_R9[3];
  auVar850._8_8_ = 0;
  auVar850._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar850,auVar544,auVar14);
  dVar4 = in_RCX[3];
  auVar1032._8_8_ = 0;
  auVar1032._0_8_ = dVar4;
  auVar1105._8_8_ = 0;
  auVar1105._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1105,auVar1032,auVar14);
  auVar851._8_8_ = 0;
  auVar851._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar851,auVar544,auVar14);
  auVar545._8_8_ = 0;
  auVar545._0_8_ = dVar5 + dVar5;
  auVar14 = vfmadd213sd_fma(auVar545,auVar1147,auVar14);
  auVar852._8_8_ = 0;
  auVar852._0_8_ = in_R9[4];
  auVar947._8_8_ = 0;
  auVar947._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar947,auVar852,auVar14);
  dVar4 = in_RCX[4];
  auVar546._8_8_ = 0;
  auVar546._0_8_ = dVar4;
  auVar1033._8_8_ = 0;
  auVar1033._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1033,auVar546,auVar14);
  auVar547._8_8_ = 0;
  auVar547._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar547,auVar852,auVar14);
  auVar853._8_8_ = 0;
  auVar853._0_8_ = in_R9[5];
  auVar383._8_8_ = 0;
  auVar383._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar383,auVar853,auVar14);
  dVar3 = in_RCX[5];
  auVar548._8_8_ = 0;
  auVar548._0_8_ = dVar3;
  auVar686._8_8_ = 0;
  auVar686._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar686,auVar548,auVar14);
  auVar384._8_8_ = 0;
  auVar384._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar384,auVar853,auVar14);
  *(long *)(ctx + 5000) = auVar14._0_8_;
  dVar3 = in_RCX[2];
  auVar687._8_8_ = 0;
  auVar687._0_8_ = in_R8[2];
  dVar4 = *in_RCX;
  dVar5 = in_RCX[1];
  auVar1148._8_8_ = 0;
  auVar1148._0_8_ = in_R8[1];
  auVar549._8_8_ = 0;
  auVar549._0_8_ = dVar3 + dVar3;
  auVar1034._8_8_ = 0;
  auVar1034._0_8_ = (dVar4 + dVar4) * *in_R8;
  auVar14 = vfmadd231sd_fma(auVar1034,auVar687,auVar549);
  auVar550._8_8_ = 0;
  auVar550._0_8_ = in_R8[3];
  auVar854._8_8_ = 0;
  auVar854._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar854,auVar550,auVar14);
  dVar4 = in_RCX[3];
  auVar1035._8_8_ = 0;
  auVar1035._0_8_ = dVar4;
  auVar1106._8_8_ = 0;
  auVar1106._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1106,auVar1035,auVar14);
  auVar855._8_8_ = 0;
  auVar855._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar855,auVar550,auVar14);
  auVar551._8_8_ = 0;
  auVar551._0_8_ = dVar5 + dVar5;
  auVar14 = vfmadd213sd_fma(auVar551,auVar1148,auVar14);
  auVar856._8_8_ = 0;
  auVar856._0_8_ = in_R8[4];
  auVar948._8_8_ = 0;
  auVar948._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar948,auVar856,auVar14);
  dVar4 = in_RCX[4];
  auVar552._8_8_ = 0;
  auVar552._0_8_ = dVar4;
  auVar1036._8_8_ = 0;
  auVar1036._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1036,auVar552,auVar14);
  auVar553._8_8_ = 0;
  auVar553._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar553,auVar856,auVar14);
  auVar857._8_8_ = 0;
  auVar857._0_8_ = in_R8[5];
  auVar385._8_8_ = 0;
  auVar385._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar385,auVar857,auVar14);
  dVar3 = in_RCX[5];
  auVar554._8_8_ = 0;
  auVar554._0_8_ = dVar3;
  auVar688._8_8_ = 0;
  auVar688._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar688,auVar554,auVar14);
  auVar386._8_8_ = 0;
  auVar386._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar386,auVar857,auVar14);
  *(long *)(ctx + 0x1450) = auVar14._0_8_;
  dVar3 = *in_RCX;
  dVar4 = in_RCX[1];
  dVar5 = in_RCX[3];
  auVar858._8_8_ = 0;
  auVar858._0_8_ = dVar5;
  dVar6 = in_RCX[4];
  auVar689._8_8_ = 0;
  auVar689._0_8_ = dVar3 * -2.0;
  auVar1037._8_8_ = 0;
  auVar1037._0_8_ = dVar4 * -2.0 * dVar6;
  auVar14 = vfmadd231sd_fma(auVar1037,auVar858,auVar689);
  dVar7 = in_RCX[2];
  dVar8 = in_RCX[5];
  auVar1107._8_8_ = 0;
  auVar1107._0_8_ = dVar8;
  auVar1149._8_8_ = 0;
  auVar1149._0_8_ = dVar7 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1149,auVar1107,auVar14);
  *(double *)(ctx + 0x1518) =
       dVar8 * dVar8 +
       dVar7 * dVar7 + dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + auVar14._0_8_ + dVar3 * dVar3
  ;
  dVar3 = *in_RDX;
  dVar4 = in_RDX[1];
  auVar859._8_8_ = 0;
  auVar859._0_8_ = in_R9[3];
  auVar949._8_8_ = 0;
  auVar949._0_8_ = *in_R9;
  auVar1038._8_8_ = 0;
  auVar1038._0_8_ = in_R9[1];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = in_R9[3] * dVar3 * -2.0;
  auVar690._8_8_ = 0;
  auVar690._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar387,auVar949,auVar690);
  dVar3 = in_RDX[3];
  auVar691._8_8_ = 0;
  auVar691._0_8_ = dVar3;
  auVar950._8_8_ = 0;
  auVar950._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar950,auVar691,auVar14);
  auVar388._8_8_ = 0;
  auVar388._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar388,auVar859,auVar14);
  auVar692._8_8_ = 0;
  auVar692._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar692,auVar1038,auVar14);
  auVar389._8_8_ = 0;
  auVar389._0_8_ = in_R9[4];
  auVar555._8_8_ = 0;
  auVar555._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar555,auVar389,auVar14);
  dVar3 = in_RDX[4];
  auVar693._8_8_ = 0;
  auVar693._0_8_ = dVar3;
  auVar860._8_8_ = 0;
  auVar860._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar860,auVar693,auVar14);
  auVar556._8_8_ = 0;
  auVar556._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar556,auVar389,auVar14);
  dVar3 = in_RDX[2];
  auVar861._8_8_ = 0;
  auVar861._0_8_ = in_R9[2];
  auVar694._8_8_ = 0;
  auVar694._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar694,auVar861,auVar14);
  auVar557._8_8_ = 0;
  auVar557._0_8_ = in_R9[5];
  auVar390._8_8_ = 0;
  auVar390._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar390,auVar557,auVar14);
  dVar3 = in_RDX[5];
  auVar695._8_8_ = 0;
  auVar695._0_8_ = dVar3;
  auVar862._8_8_ = 0;
  auVar862._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar862,auVar695,auVar14);
  auVar391._8_8_ = 0;
  auVar391._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar391,auVar557,auVar14);
  *(long *)(ctx + 0x15e0) = auVar14._0_8_;
  dVar3 = *in_RDX;
  dVar4 = in_RDX[1];
  auVar863._8_8_ = 0;
  auVar863._0_8_ = in_R8[3];
  auVar951._8_8_ = 0;
  auVar951._0_8_ = *in_R8;
  auVar1039._8_8_ = 0;
  auVar1039._0_8_ = in_R8[1];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = in_R8[3] * dVar3 * -2.0;
  auVar696._8_8_ = 0;
  auVar696._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar392,auVar951,auVar696);
  dVar3 = in_RDX[3];
  auVar697._8_8_ = 0;
  auVar697._0_8_ = dVar3;
  auVar952._8_8_ = 0;
  auVar952._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar952,auVar697,auVar14);
  auVar393._8_8_ = 0;
  auVar393._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar393,auVar863,auVar14);
  auVar698._8_8_ = 0;
  auVar698._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar698,auVar1039,auVar14);
  auVar394._8_8_ = 0;
  auVar394._0_8_ = in_R8[4];
  auVar558._8_8_ = 0;
  auVar558._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar558,auVar394,auVar14);
  dVar3 = in_RDX[4];
  auVar699._8_8_ = 0;
  auVar699._0_8_ = dVar3;
  auVar864._8_8_ = 0;
  auVar864._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar864,auVar699,auVar14);
  auVar559._8_8_ = 0;
  auVar559._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar559,auVar394,auVar14);
  dVar3 = in_RDX[2];
  auVar865._8_8_ = 0;
  auVar865._0_8_ = in_R8[2];
  auVar700._8_8_ = 0;
  auVar700._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar700,auVar865,auVar14);
  auVar560._8_8_ = 0;
  auVar560._0_8_ = in_R8[5];
  auVar395._8_8_ = 0;
  auVar395._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar395,auVar560,auVar14);
  dVar3 = in_RDX[5];
  auVar701._8_8_ = 0;
  auVar701._0_8_ = dVar3;
  auVar866._8_8_ = 0;
  auVar866._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar866,auVar701,auVar14);
  auVar396._8_8_ = 0;
  auVar396._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar396,auVar560,auVar14);
  *(long *)(ctx + 0x16a8) = auVar14._0_8_;
  dVar3 = *in_RDX;
  dVar4 = in_RDX[1];
  auVar867._8_8_ = 0;
  auVar867._0_8_ = in_RCX[3];
  auVar953._8_8_ = 0;
  auVar953._0_8_ = *in_RCX;
  auVar1040._8_8_ = 0;
  auVar1040._0_8_ = in_RCX[1];
  auVar397._8_8_ = 0;
  auVar397._0_8_ = in_RCX[3] * dVar3 * -2.0;
  auVar702._8_8_ = 0;
  auVar702._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar397,auVar953,auVar702);
  dVar3 = in_RDX[3];
  auVar703._8_8_ = 0;
  auVar703._0_8_ = dVar3;
  auVar954._8_8_ = 0;
  auVar954._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar954,auVar703,auVar14);
  auVar398._8_8_ = 0;
  auVar398._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar398,auVar867,auVar14);
  auVar704._8_8_ = 0;
  auVar704._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar704,auVar1040,auVar14);
  auVar399._8_8_ = 0;
  auVar399._0_8_ = in_RCX[4];
  auVar561._8_8_ = 0;
  auVar561._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar561,auVar399,auVar14);
  dVar3 = in_RDX[4];
  auVar705._8_8_ = 0;
  auVar705._0_8_ = dVar3;
  auVar868._8_8_ = 0;
  auVar868._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar868,auVar705,auVar14);
  auVar562._8_8_ = 0;
  auVar562._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar562,auVar399,auVar14);
  dVar3 = in_RDX[2];
  auVar869._8_8_ = 0;
  auVar869._0_8_ = in_RCX[2];
  auVar706._8_8_ = 0;
  auVar706._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar706,auVar869,auVar14);
  auVar563._8_8_ = 0;
  auVar563._0_8_ = in_RCX[5];
  auVar400._8_8_ = 0;
  auVar400._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar400,auVar563,auVar14);
  dVar3 = in_RDX[5];
  auVar707._8_8_ = 0;
  auVar707._0_8_ = dVar3;
  auVar870._8_8_ = 0;
  auVar870._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar870,auVar707,auVar14);
  auVar401._8_8_ = 0;
  auVar401._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar401,auVar563,auVar14);
  *(long *)(ctx + 6000) = auVar14._0_8_;
  dVar3 = *in_RDX;
  dVar4 = in_RDX[1];
  dVar5 = in_RDX[3];
  auVar871._8_8_ = 0;
  auVar871._0_8_ = dVar5;
  dVar6 = in_RDX[4];
  auVar708._8_8_ = 0;
  auVar708._0_8_ = dVar3 * -2.0;
  auVar1041._8_8_ = 0;
  auVar1041._0_8_ = dVar4 * -2.0 * dVar6;
  auVar14 = vfmadd231sd_fma(auVar1041,auVar871,auVar708);
  dVar7 = in_RDX[2];
  dVar8 = in_RDX[5];
  auVar1108._8_8_ = 0;
  auVar1108._0_8_ = dVar8;
  auVar1150._8_8_ = 0;
  auVar1150._0_8_ = dVar7 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1150,auVar1108,auVar14);
  *(double *)(ctx + 0x1838) =
       dVar8 * dVar8 +
       dVar7 * dVar7 + dVar6 * dVar6 + dVar4 * dVar4 + dVar5 * dVar5 + auVar14._0_8_ + dVar3 * dVar3
  ;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar872._8_8_ = 0;
  auVar872._0_8_ = in_R9[3];
  auVar955._8_8_ = 0;
  auVar955._0_8_ = *in_R9;
  auVar1042._8_8_ = 0;
  auVar1042._0_8_ = in_R9[1];
  auVar402._8_8_ = 0;
  auVar402._0_8_ = in_R9[3] * dVar3 * -2.0;
  auVar709._8_8_ = 0;
  auVar709._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar402,auVar955,auVar709);
  dVar3 = in_RSI[3];
  auVar710._8_8_ = 0;
  auVar710._0_8_ = dVar3;
  auVar956._8_8_ = 0;
  auVar956._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar956,auVar710,auVar14);
  auVar403._8_8_ = 0;
  auVar403._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar403,auVar872,auVar14);
  auVar711._8_8_ = 0;
  auVar711._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar711,auVar1042,auVar14);
  auVar404._8_8_ = 0;
  auVar404._0_8_ = in_R9[4];
  auVar564._8_8_ = 0;
  auVar564._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar564,auVar404,auVar14);
  dVar3 = in_RSI[4];
  auVar712._8_8_ = 0;
  auVar712._0_8_ = dVar3;
  auVar873._8_8_ = 0;
  auVar873._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar873,auVar712,auVar14);
  auVar565._8_8_ = 0;
  auVar565._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar565,auVar404,auVar14);
  dVar3 = in_RSI[2];
  auVar874._8_8_ = 0;
  auVar874._0_8_ = in_R9[2];
  auVar713._8_8_ = 0;
  auVar713._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar713,auVar874,auVar14);
  auVar566._8_8_ = 0;
  auVar566._0_8_ = in_R9[5];
  auVar405._8_8_ = 0;
  auVar405._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar405,auVar566,auVar14);
  dVar3 = in_RSI[5];
  auVar714._8_8_ = 0;
  auVar714._0_8_ = dVar3;
  auVar875._8_8_ = 0;
  auVar875._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar875,auVar714,auVar14);
  auVar406._8_8_ = 0;
  auVar406._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar406,auVar566,auVar14);
  *(long *)(ctx + 0x1900) = auVar14._0_8_;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar876._8_8_ = 0;
  auVar876._0_8_ = in_R8[3];
  auVar957._8_8_ = 0;
  auVar957._0_8_ = *in_R8;
  auVar1043._8_8_ = 0;
  auVar1043._0_8_ = in_R8[1];
  auVar407._8_8_ = 0;
  auVar407._0_8_ = in_R8[3] * dVar3 * -2.0;
  auVar715._8_8_ = 0;
  auVar715._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar407,auVar957,auVar715);
  dVar3 = in_RSI[3];
  auVar716._8_8_ = 0;
  auVar716._0_8_ = dVar3;
  auVar958._8_8_ = 0;
  auVar958._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar958,auVar716,auVar14);
  auVar408._8_8_ = 0;
  auVar408._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar408,auVar876,auVar14);
  auVar717._8_8_ = 0;
  auVar717._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar717,auVar1043,auVar14);
  auVar409._8_8_ = 0;
  auVar409._0_8_ = in_R8[4];
  auVar567._8_8_ = 0;
  auVar567._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar567,auVar409,auVar14);
  dVar3 = in_RSI[4];
  auVar718._8_8_ = 0;
  auVar718._0_8_ = dVar3;
  auVar877._8_8_ = 0;
  auVar877._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar877,auVar718,auVar14);
  auVar568._8_8_ = 0;
  auVar568._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar568,auVar409,auVar14);
  dVar3 = in_RSI[2];
  auVar878._8_8_ = 0;
  auVar878._0_8_ = in_R8[2];
  auVar719._8_8_ = 0;
  auVar719._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar719,auVar878,auVar14);
  auVar569._8_8_ = 0;
  auVar569._0_8_ = in_R8[5];
  auVar410._8_8_ = 0;
  auVar410._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar410,auVar569,auVar14);
  dVar3 = in_RSI[5];
  auVar720._8_8_ = 0;
  auVar720._0_8_ = dVar3;
  auVar879._8_8_ = 0;
  auVar879._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar879,auVar720,auVar14);
  auVar411._8_8_ = 0;
  auVar411._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar411,auVar569,auVar14);
  *(long *)(ctx + 0x19c8) = auVar14._0_8_;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar880._8_8_ = 0;
  auVar880._0_8_ = in_RCX[3];
  auVar959._8_8_ = 0;
  auVar959._0_8_ = *in_RCX;
  auVar1044._8_8_ = 0;
  auVar1044._0_8_ = in_RCX[1];
  auVar412._8_8_ = 0;
  auVar412._0_8_ = in_RCX[3] * dVar3 * -2.0;
  auVar721._8_8_ = 0;
  auVar721._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar412,auVar959,auVar721);
  dVar3 = in_RSI[3];
  auVar722._8_8_ = 0;
  auVar722._0_8_ = dVar3;
  auVar960._8_8_ = 0;
  auVar960._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar960,auVar722,auVar14);
  auVar413._8_8_ = 0;
  auVar413._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar413,auVar880,auVar14);
  auVar723._8_8_ = 0;
  auVar723._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar723,auVar1044,auVar14);
  auVar414._8_8_ = 0;
  auVar414._0_8_ = in_RCX[4];
  auVar570._8_8_ = 0;
  auVar570._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar570,auVar414,auVar14);
  dVar3 = in_RSI[4];
  auVar724._8_8_ = 0;
  auVar724._0_8_ = dVar3;
  auVar881._8_8_ = 0;
  auVar881._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar881,auVar724,auVar14);
  auVar571._8_8_ = 0;
  auVar571._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar571,auVar414,auVar14);
  dVar3 = in_RSI[2];
  auVar882._8_8_ = 0;
  auVar882._0_8_ = in_RCX[2];
  auVar725._8_8_ = 0;
  auVar725._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar725,auVar882,auVar14);
  auVar572._8_8_ = 0;
  auVar572._0_8_ = in_RCX[5];
  auVar415._8_8_ = 0;
  auVar415._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar415,auVar572,auVar14);
  dVar3 = in_RSI[5];
  auVar726._8_8_ = 0;
  auVar726._0_8_ = dVar3;
  auVar883._8_8_ = 0;
  auVar883._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar883,auVar726,auVar14);
  auVar416._8_8_ = 0;
  auVar416._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar416,auVar572,auVar14);
  *(long *)(ctx + 0x1a90) = auVar14._0_8_;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar884._8_8_ = 0;
  auVar884._0_8_ = in_RDX[3];
  auVar961._8_8_ = 0;
  auVar961._0_8_ = *in_RDX;
  auVar1045._8_8_ = 0;
  auVar1045._0_8_ = in_RDX[1];
  auVar417._8_8_ = 0;
  auVar417._0_8_ = in_RDX[3] * dVar3 * -2.0;
  auVar727._8_8_ = 0;
  auVar727._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd231sd_fma(auVar417,auVar961,auVar727);
  dVar3 = in_RSI[3];
  auVar728._8_8_ = 0;
  auVar728._0_8_ = dVar3;
  auVar962._8_8_ = 0;
  auVar962._0_8_ = *in_RDX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar962,auVar728,auVar14);
  auVar418._8_8_ = 0;
  auVar418._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar418,auVar884,auVar14);
  auVar729._8_8_ = 0;
  auVar729._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar729,auVar1045,auVar14);
  auVar419._8_8_ = 0;
  auVar419._0_8_ = in_RDX[4];
  auVar573._8_8_ = 0;
  auVar573._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar573,auVar419,auVar14);
  dVar3 = in_RSI[4];
  auVar730._8_8_ = 0;
  auVar730._0_8_ = dVar3;
  auVar885._8_8_ = 0;
  auVar885._0_8_ = in_RDX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar885,auVar730,auVar14);
  auVar574._8_8_ = 0;
  auVar574._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar574,auVar419,auVar14);
  dVar3 = in_RSI[2];
  auVar886._8_8_ = 0;
  auVar886._0_8_ = in_RDX[2];
  auVar731._8_8_ = 0;
  auVar731._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar731,auVar886,auVar14);
  auVar575._8_8_ = 0;
  auVar575._0_8_ = in_RDX[5];
  auVar420._8_8_ = 0;
  auVar420._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar420,auVar575,auVar14);
  dVar3 = in_RSI[5];
  auVar732._8_8_ = 0;
  auVar732._0_8_ = dVar3;
  auVar887._8_8_ = 0;
  auVar887._0_8_ = in_RDX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar887,auVar732,auVar14);
  auVar421._8_8_ = 0;
  auVar421._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar421,auVar575,auVar14);
  *(long *)(ctx + 7000) = auVar14._0_8_;
  dVar3 = *in_RSI;
  dVar4 = in_RSI[1];
  auVar230._8_8_ = 0;
  auVar230._0_8_ =
       (dVar1 - dVar2) * (dVar1 - dVar2) +
       auVar15._0_8_ * auVar15._0_8_ + auVar15._8_8_ * auVar15._8_8_;
  auVar14 = vsqrtsd_avx(auVar230,auVar230);
  dVar1 = in_RSI[3];
  auVar733._8_8_ = 0;
  auVar733._0_8_ = dVar1;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = dVar3 * dVar3 - auVar14._0_8_ * auVar14._0_8_;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar422,auVar733,auVar231);
  dVar2 = in_RSI[4];
  auVar423._8_8_ = 0;
  auVar423._0_8_ = dVar2;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = dVar4 * dVar4 + dVar1 * dVar1 + auVar14._0_8_;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar576,auVar423,auVar232);
  dVar1 = in_RSI[2];
  dVar3 = in_RSI[5];
  auVar577._8_8_ = 0;
  auVar577._0_8_ = dVar3;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = dVar1 * dVar1 + dVar2 * dVar2 + auVar14._0_8_;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar424,auVar577,auVar233);
  *(double *)(ctx + 0x1c20) = dVar3 * dVar3 + auVar14._0_8_;
  dVar1 = *in_R9;
  dVar2 = in_R9[1];
  dVar3 = in_R9[6];
  auVar734._8_8_ = 0;
  auVar734._0_8_ = dVar3;
  dVar4 = in_R9[7];
  auVar578._8_8_ = 0;
  auVar578._0_8_ = dVar1 * -2.0;
  auVar963._8_8_ = 0;
  auVar963._0_8_ = dVar2 * -2.0 * dVar4;
  auVar14 = vfmadd231sd_fma(auVar963,auVar734,auVar578);
  dVar5 = in_R9[2];
  dVar6 = in_R9[8];
  auVar1046._8_8_ = 0;
  auVar1046._0_8_ = dVar6;
  auVar1109._8_8_ = 0;
  auVar1109._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1109,auVar1046,auVar14);
  *(double *)(ctx + 0x1138) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar14._0_8_ + dVar1 * dVar1
  ;
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  auVar888._8_8_ = 0;
  auVar888._0_8_ = *in_R9;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = dVar1 + dVar1;
  auVar735._8_8_ = 0;
  auVar735._0_8_ = (dVar2 + dVar2) * in_R9[1];
  auVar14 = vfmadd231sd_fma(auVar735,auVar888,auVar579);
  dVar3 = in_R8[2];
  auVar1110._8_8_ = 0;
  auVar1110._0_8_ = in_R9[2];
  auVar1047._8_8_ = 0;
  auVar1047._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1047,auVar1110,auVar14);
  auVar736._8_8_ = 0;
  auVar736._0_8_ = in_R9[6];
  auVar234._8_8_ = 0;
  auVar234._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar234,auVar736,auVar14);
  dVar1 = in_R8[6];
  auVar1048._8_8_ = 0;
  auVar1048._0_8_ = dVar1;
  auVar889._8_8_ = 0;
  auVar889._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar889,auVar1048,auVar14);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar235,auVar736,auVar14);
  auVar737._8_8_ = 0;
  auVar737._0_8_ = in_R9[7];
  auVar425._8_8_ = 0;
  auVar425._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar425,auVar737,auVar14);
  dVar1 = in_R8[7];
  auVar236._8_8_ = 0;
  auVar236._0_8_ = dVar1;
  auVar890._8_8_ = 0;
  auVar890._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar890,auVar236,auVar14);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar237,auVar737,auVar14);
  auVar426._8_8_ = 0;
  auVar426._0_8_ = in_R9[8];
  auVar580._8_8_ = 0;
  auVar580._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar580,auVar426,auVar14);
  dVar1 = in_R8[8];
  auVar238._8_8_ = 0;
  auVar238._0_8_ = dVar1;
  auVar738._8_8_ = 0;
  auVar738._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar738,auVar238,auVar14);
  auVar239._8_8_ = 0;
  auVar239._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar239,auVar426,auVar14);
  *(long *)(ctx + 0x1200) = auVar14._0_8_;
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  dVar3 = in_R8[6];
  auVar739._8_8_ = 0;
  auVar739._0_8_ = dVar3;
  dVar4 = in_R8[7];
  auVar581._8_8_ = 0;
  auVar581._0_8_ = dVar1 * -2.0;
  auVar964._8_8_ = 0;
  auVar964._0_8_ = dVar2 * -2.0 * dVar4;
  auVar14 = vfmadd231sd_fma(auVar964,auVar739,auVar581);
  dVar5 = in_R8[2];
  dVar6 = in_R8[8];
  auVar1049._8_8_ = 0;
  auVar1049._0_8_ = dVar6;
  auVar1111._8_8_ = 0;
  auVar1111._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1111,auVar1049,auVar14);
  *(double *)(ctx + 0x12c8) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar14._0_8_ + dVar1 * dVar1
  ;
  dVar1 = in_RCX[2];
  auVar582._8_8_ = 0;
  auVar582._0_8_ = in_R9[2];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[1];
  auVar1112._8_8_ = 0;
  auVar1112._0_8_ = in_R9[1];
  auVar427._8_8_ = 0;
  auVar427._0_8_ = dVar1 + dVar1;
  auVar965._8_8_ = 0;
  auVar965._0_8_ = (dVar2 + dVar2) * *in_R9;
  auVar14 = vfmadd231sd_fma(auVar965,auVar582,auVar427);
  auVar428._8_8_ = 0;
  auVar428._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar428,auVar1112,auVar14);
  auVar966._8_8_ = 0;
  auVar966._0_8_ = in_R9[6];
  auVar740._8_8_ = 0;
  auVar740._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar740,auVar966,auVar14);
  dVar2 = in_RCX[6];
  auVar429._8_8_ = 0;
  auVar429._0_8_ = dVar2;
  auVar1050._8_8_ = 0;
  auVar1050._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1050,auVar429,auVar14);
  auVar430._8_8_ = 0;
  auVar430._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar430,auVar966,auVar14);
  auVar741._8_8_ = 0;
  auVar741._0_8_ = in_R9[7];
  auVar891._8_8_ = 0;
  auVar891._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar891,auVar741,auVar14);
  dVar2 = in_RCX[7];
  auVar431._8_8_ = 0;
  auVar431._0_8_ = dVar2;
  auVar967._8_8_ = 0;
  auVar967._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar967,auVar431,auVar14);
  auVar432._8_8_ = 0;
  auVar432._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar432,auVar741,auVar14);
  auVar742._8_8_ = 0;
  auVar742._0_8_ = in_R9[8];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar240,auVar742,auVar14);
  dVar1 = in_RCX[8];
  auVar433._8_8_ = 0;
  auVar433._0_8_ = dVar1;
  auVar583._8_8_ = 0;
  auVar583._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar583,auVar433,auVar14);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar241,auVar742,auVar14);
  *(long *)(ctx + 0x1390) = auVar14._0_8_;
  dVar1 = in_RCX[2];
  auVar584._8_8_ = 0;
  auVar584._0_8_ = in_R8[2];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[1];
  auVar1113._8_8_ = 0;
  auVar1113._0_8_ = in_R8[1];
  auVar434._8_8_ = 0;
  auVar434._0_8_ = dVar1 + dVar1;
  auVar968._8_8_ = 0;
  auVar968._0_8_ = (dVar2 + dVar2) * *in_R8;
  auVar14 = vfmadd231sd_fma(auVar968,auVar584,auVar434);
  auVar435._8_8_ = 0;
  auVar435._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar435,auVar1113,auVar14);
  auVar969._8_8_ = 0;
  auVar969._0_8_ = in_R8[6];
  auVar743._8_8_ = 0;
  auVar743._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar743,auVar969,auVar14);
  dVar2 = in_RCX[6];
  auVar436._8_8_ = 0;
  auVar436._0_8_ = dVar2;
  auVar1051._8_8_ = 0;
  auVar1051._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1051,auVar436,auVar14);
  auVar437._8_8_ = 0;
  auVar437._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar437,auVar969,auVar14);
  auVar744._8_8_ = 0;
  auVar744._0_8_ = in_R8[7];
  auVar892._8_8_ = 0;
  auVar892._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar892,auVar744,auVar14);
  dVar2 = in_RCX[7];
  auVar438._8_8_ = 0;
  auVar438._0_8_ = dVar2;
  auVar970._8_8_ = 0;
  auVar970._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar970,auVar438,auVar14);
  auVar439._8_8_ = 0;
  auVar439._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar439,auVar744,auVar14);
  auVar745._8_8_ = 0;
  auVar745._0_8_ = in_R8[8];
  auVar242._8_8_ = 0;
  auVar242._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar242,auVar745,auVar14);
  dVar1 = in_RCX[8];
  auVar440._8_8_ = 0;
  auVar440._0_8_ = dVar1;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar585,auVar440,auVar14);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar243,auVar745,auVar14);
  *(long *)(ctx + 0x1458) = auVar14._0_8_;
  dVar1 = *in_RCX;
  dVar2 = in_RCX[1];
  dVar3 = in_RCX[6];
  auVar746._8_8_ = 0;
  auVar746._0_8_ = dVar3;
  dVar4 = in_RCX[7];
  auVar586._8_8_ = 0;
  auVar586._0_8_ = dVar1 * -2.0;
  auVar971._8_8_ = 0;
  auVar971._0_8_ = dVar2 * -2.0 * dVar4;
  auVar14 = vfmadd231sd_fma(auVar971,auVar746,auVar586);
  dVar5 = in_RCX[2];
  dVar6 = in_RCX[8];
  auVar1052._8_8_ = 0;
  auVar1052._0_8_ = dVar6;
  auVar1114._8_8_ = 0;
  auVar1114._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1114,auVar1052,auVar14);
  *(double *)(ctx + 0x1520) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar14._0_8_ + dVar1 * dVar1
  ;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar893._8_8_ = 0;
  auVar893._0_8_ = *in_R9;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = dVar1 + dVar1;
  auVar747._8_8_ = 0;
  auVar747._0_8_ = (dVar2 + dVar2) * in_R9[1];
  auVar14 = vfmadd231sd_fma(auVar747,auVar893,auVar587);
  dVar3 = in_RDX[2];
  auVar1115._8_8_ = 0;
  auVar1115._0_8_ = in_R9[2];
  auVar1053._8_8_ = 0;
  auVar1053._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1053,auVar1115,auVar14);
  auVar748._8_8_ = 0;
  auVar748._0_8_ = in_R9[6];
  auVar244._8_8_ = 0;
  auVar244._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar244,auVar748,auVar14);
  dVar1 = in_RDX[6];
  auVar1054._8_8_ = 0;
  auVar1054._0_8_ = dVar1;
  auVar894._8_8_ = 0;
  auVar894._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar894,auVar1054,auVar14);
  auVar245._8_8_ = 0;
  auVar245._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar245,auVar748,auVar14);
  auVar749._8_8_ = 0;
  auVar749._0_8_ = in_R9[7];
  auVar441._8_8_ = 0;
  auVar441._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar441,auVar749,auVar14);
  dVar1 = in_RDX[7];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = dVar1;
  auVar895._8_8_ = 0;
  auVar895._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar895,auVar246,auVar14);
  auVar247._8_8_ = 0;
  auVar247._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar247,auVar749,auVar14);
  auVar442._8_8_ = 0;
  auVar442._0_8_ = in_R9[8];
  auVar588._8_8_ = 0;
  auVar588._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar588,auVar442,auVar14);
  dVar1 = in_RDX[8];
  auVar248._8_8_ = 0;
  auVar248._0_8_ = dVar1;
  auVar750._8_8_ = 0;
  auVar750._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar750,auVar248,auVar14);
  auVar249._8_8_ = 0;
  auVar249._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar249,auVar442,auVar14);
  *(long *)(ctx + 0x15e8) = auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar896._8_8_ = 0;
  auVar896._0_8_ = *in_R8;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = dVar1 + dVar1;
  auVar751._8_8_ = 0;
  auVar751._0_8_ = (dVar2 + dVar2) * in_R8[1];
  auVar14 = vfmadd231sd_fma(auVar751,auVar896,auVar589);
  dVar3 = in_RDX[2];
  auVar1116._8_8_ = 0;
  auVar1116._0_8_ = in_R8[2];
  auVar1055._8_8_ = 0;
  auVar1055._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1055,auVar1116,auVar14);
  auVar752._8_8_ = 0;
  auVar752._0_8_ = in_R8[6];
  auVar250._8_8_ = 0;
  auVar250._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar250,auVar752,auVar14);
  dVar1 = in_RDX[6];
  auVar1056._8_8_ = 0;
  auVar1056._0_8_ = dVar1;
  auVar897._8_8_ = 0;
  auVar897._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar897,auVar1056,auVar14);
  auVar251._8_8_ = 0;
  auVar251._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar251,auVar752,auVar14);
  auVar753._8_8_ = 0;
  auVar753._0_8_ = in_R8[7];
  auVar443._8_8_ = 0;
  auVar443._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar443,auVar753,auVar14);
  dVar1 = in_RDX[7];
  auVar252._8_8_ = 0;
  auVar252._0_8_ = dVar1;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar898,auVar252,auVar14);
  auVar253._8_8_ = 0;
  auVar253._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar253,auVar753,auVar14);
  auVar444._8_8_ = 0;
  auVar444._0_8_ = in_R8[8];
  auVar590._8_8_ = 0;
  auVar590._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar590,auVar444,auVar14);
  dVar1 = in_RDX[8];
  auVar254._8_8_ = 0;
  auVar254._0_8_ = dVar1;
  auVar754._8_8_ = 0;
  auVar754._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar754,auVar254,auVar14);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar255,auVar444,auVar14);
  *(long *)(ctx + 0x16b0) = auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar899._8_8_ = 0;
  auVar899._0_8_ = *in_RCX;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = dVar1 + dVar1;
  auVar755._8_8_ = 0;
  auVar755._0_8_ = (dVar2 + dVar2) * in_RCX[1];
  auVar14 = vfmadd231sd_fma(auVar755,auVar899,auVar591);
  dVar3 = in_RDX[2];
  auVar1117._8_8_ = 0;
  auVar1117._0_8_ = in_RCX[2];
  auVar1057._8_8_ = 0;
  auVar1057._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1057,auVar1117,auVar14);
  auVar756._8_8_ = 0;
  auVar756._0_8_ = in_RCX[6];
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar256,auVar756,auVar14);
  dVar1 = in_RDX[6];
  auVar1058._8_8_ = 0;
  auVar1058._0_8_ = dVar1;
  auVar900._8_8_ = 0;
  auVar900._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar900,auVar1058,auVar14);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar257,auVar756,auVar14);
  auVar757._8_8_ = 0;
  auVar757._0_8_ = in_RCX[7];
  auVar445._8_8_ = 0;
  auVar445._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar445,auVar757,auVar14);
  dVar1 = in_RDX[7];
  auVar258._8_8_ = 0;
  auVar258._0_8_ = dVar1;
  auVar901._8_8_ = 0;
  auVar901._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar901,auVar258,auVar14);
  auVar259._8_8_ = 0;
  auVar259._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar259,auVar757,auVar14);
  auVar446._8_8_ = 0;
  auVar446._0_8_ = in_RCX[8];
  auVar592._8_8_ = 0;
  auVar592._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar592,auVar446,auVar14);
  dVar1 = in_RDX[8];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = dVar1;
  auVar758._8_8_ = 0;
  auVar758._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar758,auVar260,auVar14);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar261,auVar446,auVar14);
  *(long *)(ctx + 0x1778) = auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  dVar3 = in_RDX[6];
  auVar759._8_8_ = 0;
  auVar759._0_8_ = dVar3;
  dVar4 = in_RDX[7];
  auVar593._8_8_ = 0;
  auVar593._0_8_ = dVar1 * -2.0;
  auVar972._8_8_ = 0;
  auVar972._0_8_ = dVar2 * -2.0 * dVar4;
  auVar14 = vfmadd231sd_fma(auVar972,auVar759,auVar593);
  dVar5 = in_RDX[2];
  dVar6 = in_RDX[8];
  auVar1059._8_8_ = 0;
  auVar1059._0_8_ = dVar6;
  auVar1118._8_8_ = 0;
  auVar1118._0_8_ = dVar5 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar1118,auVar1059,auVar14);
  *(double *)(ctx + 0x1840) =
       dVar6 * dVar6 +
       dVar4 * dVar4 + dVar3 * dVar3 + dVar5 * dVar5 + dVar2 * dVar2 + auVar14._0_8_ + dVar1 * dVar1
  ;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar760._8_8_ = 0;
  auVar760._0_8_ = in_R9[6];
  auVar973._8_8_ = 0;
  auVar973._0_8_ = in_R9[1];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = *in_R9 * (dVar1 + dVar1);
  auVar594._8_8_ = 0;
  auVar594._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd231sd_fma(auVar262,auVar760,auVar594);
  auVar595._8_8_ = 0;
  auVar595._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar595,auVar973,auVar14);
  dVar1 = in_RSI[2];
  auVar1119._8_8_ = 0;
  auVar1119._0_8_ = in_R9[2];
  auVar1060._8_8_ = 0;
  auVar1060._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1060,auVar1119,auVar14);
  dVar3 = in_RSI[6];
  auVar596._8_8_ = 0;
  auVar596._0_8_ = dVar3;
  auVar902._8_8_ = 0;
  auVar902._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar902,auVar596,auVar14);
  auVar597._8_8_ = 0;
  auVar597._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar597,auVar760,auVar14);
  auVar761._8_8_ = 0;
  auVar761._0_8_ = in_R9[7];
  auVar447._8_8_ = 0;
  auVar447._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar447,auVar761,auVar14);
  dVar2 = in_RSI[7];
  auVar598._8_8_ = 0;
  auVar598._0_8_ = dVar2;
  auVar903._8_8_ = 0;
  auVar903._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar903,auVar598,auVar14);
  auVar448._8_8_ = 0;
  auVar448._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar448,auVar761,auVar14);
  auVar599._8_8_ = 0;
  auVar599._0_8_ = in_R9[8];
  auVar263._8_8_ = 0;
  auVar263._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar263,auVar599,auVar14);
  dVar1 = in_RSI[8];
  auVar449._8_8_ = 0;
  auVar449._0_8_ = dVar1;
  auVar762._8_8_ = 0;
  auVar762._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar762,auVar449,auVar14);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar264,auVar599,auVar14);
  *(long *)(ctx + 0x1908) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar763._8_8_ = 0;
  auVar763._0_8_ = in_R8[6];
  auVar974._8_8_ = 0;
  auVar974._0_8_ = in_R8[1];
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *in_R8 * (dVar1 + dVar1);
  auVar600._8_8_ = 0;
  auVar600._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd231sd_fma(auVar265,auVar763,auVar600);
  auVar601._8_8_ = 0;
  auVar601._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar601,auVar974,auVar14);
  dVar1 = in_RSI[2];
  auVar1120._8_8_ = 0;
  auVar1120._0_8_ = in_R8[2];
  auVar1061._8_8_ = 0;
  auVar1061._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1061,auVar1120,auVar14);
  dVar3 = in_RSI[6];
  auVar602._8_8_ = 0;
  auVar602._0_8_ = dVar3;
  auVar904._8_8_ = 0;
  auVar904._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar904,auVar602,auVar14);
  auVar603._8_8_ = 0;
  auVar603._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar603,auVar763,auVar14);
  auVar764._8_8_ = 0;
  auVar764._0_8_ = in_R8[7];
  auVar450._8_8_ = 0;
  auVar450._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar450,auVar764,auVar14);
  dVar2 = in_RSI[7];
  auVar604._8_8_ = 0;
  auVar604._0_8_ = dVar2;
  auVar905._8_8_ = 0;
  auVar905._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar905,auVar604,auVar14);
  auVar451._8_8_ = 0;
  auVar451._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar451,auVar764,auVar14);
  auVar605._8_8_ = 0;
  auVar605._0_8_ = in_R8[8];
  auVar266._8_8_ = 0;
  auVar266._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar266,auVar605,auVar14);
  dVar1 = in_RSI[8];
  auVar452._8_8_ = 0;
  auVar452._0_8_ = dVar1;
  auVar765._8_8_ = 0;
  auVar765._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar765,auVar452,auVar14);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar267,auVar605,auVar14);
  *(long *)(ctx + 0x19d0) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar766._8_8_ = 0;
  auVar766._0_8_ = in_RCX[6];
  dVar3 = in_RSI[6];
  auVar975._8_8_ = 0;
  auVar975._0_8_ = *in_RCX;
  auVar1062._8_8_ = 0;
  auVar1062._0_8_ = in_RCX[1];
  auVar606._8_8_ = 0;
  auVar606._0_8_ = dVar1 * -2.0;
  auVar1121._8_8_ = 0;
  auVar1121._0_8_ = *in_RCX * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar1121,auVar766,auVar606);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar268,auVar975,auVar14);
  auVar607._8_8_ = 0;
  auVar607._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar607,auVar1062,auVar14);
  dVar1 = in_RSI[2];
  auVar1122._8_8_ = 0;
  auVar1122._0_8_ = in_RCX[2];
  auVar976._8_8_ = 0;
  auVar976._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar976,auVar1122,auVar14);
  auVar608._8_8_ = 0;
  auVar608._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar608,auVar766,auVar14);
  auVar767._8_8_ = 0;
  auVar767._0_8_ = in_RCX[7];
  auVar453._8_8_ = 0;
  auVar453._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar453,auVar767,auVar14);
  dVar2 = in_RSI[7];
  auVar609._8_8_ = 0;
  auVar609._0_8_ = dVar2;
  auVar906._8_8_ = 0;
  auVar906._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar906,auVar609,auVar14);
  auVar454._8_8_ = 0;
  auVar454._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar454,auVar767,auVar14);
  auVar610._8_8_ = 0;
  auVar610._0_8_ = in_RCX[8];
  auVar269._8_8_ = 0;
  auVar269._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar269,auVar610,auVar14);
  dVar1 = in_RSI[8];
  auVar455._8_8_ = 0;
  auVar455._0_8_ = dVar1;
  auVar768._8_8_ = 0;
  auVar768._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar768,auVar455,auVar14);
  auVar270._8_8_ = 0;
  auVar270._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar270,auVar610,auVar14);
  *(long *)(ctx + 0x1a98) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar769._8_8_ = 0;
  auVar769._0_8_ = in_RDX[6];
  dVar3 = in_RSI[6];
  auVar977._8_8_ = 0;
  auVar977._0_8_ = *in_RDX;
  auVar1063._8_8_ = 0;
  auVar1063._0_8_ = in_RDX[1];
  auVar611._8_8_ = 0;
  auVar611._0_8_ = dVar1 * -2.0;
  auVar1123._8_8_ = 0;
  auVar1123._0_8_ = *in_RDX * -2.0 * dVar3;
  auVar14 = vfmadd231sd_fma(auVar1123,auVar769,auVar611);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar271,auVar977,auVar14);
  auVar612._8_8_ = 0;
  auVar612._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar612,auVar1063,auVar14);
  dVar1 = in_RSI[2];
  auVar1124._8_8_ = 0;
  auVar1124._0_8_ = in_RDX[2];
  auVar978._8_8_ = 0;
  auVar978._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar978,auVar1124,auVar14);
  auVar613._8_8_ = 0;
  auVar613._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar613,auVar769,auVar14);
  auVar770._8_8_ = 0;
  auVar770._0_8_ = in_RDX[7];
  auVar456._8_8_ = 0;
  auVar456._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar456,auVar770,auVar14);
  dVar2 = in_RSI[7];
  auVar614._8_8_ = 0;
  auVar614._0_8_ = dVar2;
  auVar907._8_8_ = 0;
  auVar907._0_8_ = in_RDX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar907,auVar614,auVar14);
  auVar457._8_8_ = 0;
  auVar457._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar457,auVar770,auVar14);
  auVar615._8_8_ = 0;
  auVar615._0_8_ = in_RDX[8];
  auVar272._8_8_ = 0;
  auVar272._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar272,auVar615,auVar14);
  dVar1 = in_RSI[8];
  auVar458._8_8_ = 0;
  auVar458._0_8_ = dVar1;
  auVar771._8_8_ = 0;
  auVar771._0_8_ = in_RDX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar771,auVar458,auVar14);
  auVar273._8_8_ = 0;
  auVar273._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar273,auVar615,auVar14);
  *(long *)(ctx + 0x1b60) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = dVar9 * dVar9 + auVar16._0_8_ * auVar16._0_8_ + auVar16._8_8_ * auVar16._8_8_;
  auVar14 = vsqrtsd_avx(auVar123,auVar123);
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[6];
  auVar772._8_8_ = 0;
  auVar772._0_8_ = dVar4;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar3 * dVar3 + (dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_) + dVar2 * dVar2;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar274,auVar772,auVar124);
  dVar1 = in_RSI[7];
  auVar275._8_8_ = 0;
  auVar275._0_8_ = dVar1;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar4 * dVar4 + auVar14._0_8_;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar459,auVar275,auVar125);
  dVar2 = in_RSI[8];
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar2;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar1 * dVar1 + auVar14._0_8_;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar460,auVar276,auVar126);
  *(double *)(ctx + 0x1c28) = dVar2 * dVar2 + auVar14._0_8_;
  dVar1 = *in_R9;
  dVar2 = in_R9[1];
  dVar3 = in_R9[2];
  dVar4 = in_R9[9];
  auVar773._8_8_ = 0;
  auVar773._0_8_ = dVar4;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar1 * -2.0;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  auVar14 = vfmadd213sd_fma(auVar127,auVar773,auVar461);
  dVar1 = in_R9[10];
  auVar462._8_8_ = 0;
  auVar462._0_8_ = dVar1;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar277,auVar462,auVar14);
  dVar2 = in_R9[0xb];
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar2;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar616,auVar128,auVar14);
  *(double *)(ctx + 0x1140) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  auVar774._8_8_ = 0;
  auVar774._0_8_ = *in_R9;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = dVar1 + dVar1;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = in_R9[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar617,auVar774,auVar463);
  dVar3 = in_R8[2];
  auVar1064._8_8_ = 0;
  auVar1064._0_8_ = in_R9[2];
  auVar979._8_8_ = 0;
  auVar979._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar979,auVar1064,auVar14);
  auVar618._8_8_ = 0;
  auVar618._0_8_ = in_R9[9];
  auVar129._8_8_ = 0;
  auVar129._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar129,auVar618,auVar14);
  dVar1 = in_R8[9];
  auVar980._8_8_ = 0;
  auVar980._0_8_ = dVar1;
  auVar775._8_8_ = 0;
  auVar775._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar775,auVar980,auVar14);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar130,auVar618,auVar14);
  auVar619._8_8_ = 0;
  auVar619._0_8_ = in_R9[10];
  auVar278._8_8_ = 0;
  auVar278._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar278,auVar619,auVar14);
  dVar1 = in_R8[10];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = dVar1;
  auVar776._8_8_ = 0;
  auVar776._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar776,auVar131,auVar14);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar132,auVar619,auVar14);
  auVar279._8_8_ = 0;
  auVar279._0_8_ = in_R9[0xb];
  auVar464._8_8_ = 0;
  auVar464._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar464,auVar279,auVar14);
  dVar1 = in_R8[0xb];
  auVar133._8_8_ = 0;
  auVar133._0_8_ = dVar1;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar620,auVar133,auVar14);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar134,auVar279,auVar14);
  *(long *)(ctx + 0x1208) = auVar14._0_8_;
  dVar1 = *in_R8;
  dVar2 = in_R8[1];
  dVar3 = in_R8[2];
  dVar4 = in_R8[9];
  auVar777._8_8_ = 0;
  auVar777._0_8_ = dVar4;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar1 * -2.0;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  auVar14 = vfmadd213sd_fma(auVar135,auVar777,auVar465);
  dVar1 = in_R8[10];
  auVar466._8_8_ = 0;
  auVar466._0_8_ = dVar1;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar280,auVar466,auVar14);
  dVar2 = in_R8[0xb];
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar2;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar621,auVar136,auVar14);
  *(double *)(ctx + 0x12d0) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = in_RCX[2];
  auVar467._8_8_ = 0;
  auVar467._0_8_ = in_R9[2];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[1];
  auVar1065._8_8_ = 0;
  auVar1065._0_8_ = in_R9[1];
  auVar281._8_8_ = 0;
  auVar281._0_8_ = dVar1 + dVar1;
  auVar908._8_8_ = 0;
  auVar908._0_8_ = (dVar2 + dVar2) * *in_R9;
  auVar14 = vfmadd231sd_fma(auVar908,auVar467,auVar281);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar282,auVar1065,auVar14);
  auVar909._8_8_ = 0;
  auVar909._0_8_ = in_R9[9];
  auVar622._8_8_ = 0;
  auVar622._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar622,auVar909,auVar14);
  dVar2 = in_RCX[9];
  auVar283._8_8_ = 0;
  auVar283._0_8_ = dVar2;
  auVar981._8_8_ = 0;
  auVar981._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar981,auVar283,auVar14);
  auVar284._8_8_ = 0;
  auVar284._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar284,auVar909,auVar14);
  auVar623._8_8_ = 0;
  auVar623._0_8_ = in_R9[10];
  auVar778._8_8_ = 0;
  auVar778._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar778,auVar623,auVar14);
  dVar2 = in_RCX[10];
  auVar285._8_8_ = 0;
  auVar285._0_8_ = dVar2;
  auVar910._8_8_ = 0;
  auVar910._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar910,auVar285,auVar14);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar286,auVar623,auVar14);
  auVar624._8_8_ = 0;
  auVar624._0_8_ = in_R9[0xb];
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar137,auVar624,auVar14);
  dVar1 = in_RCX[0xb];
  auVar287._8_8_ = 0;
  auVar287._0_8_ = dVar1;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar468,auVar287,auVar14);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar138,auVar624,auVar14);
  *(long *)(ctx + 0x1398) = auVar14._0_8_;
  dVar1 = in_RCX[2];
  auVar469._8_8_ = 0;
  auVar469._0_8_ = in_R8[2];
  dVar2 = *in_RCX;
  dVar3 = in_RCX[1];
  auVar1066._8_8_ = 0;
  auVar1066._0_8_ = in_R8[1];
  auVar288._8_8_ = 0;
  auVar288._0_8_ = dVar1 + dVar1;
  auVar911._8_8_ = 0;
  auVar911._0_8_ = (dVar2 + dVar2) * *in_R8;
  auVar14 = vfmadd231sd_fma(auVar911,auVar469,auVar288);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar289,auVar1066,auVar14);
  auVar912._8_8_ = 0;
  auVar912._0_8_ = in_R8[9];
  auVar625._8_8_ = 0;
  auVar625._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar625,auVar912,auVar14);
  dVar2 = in_RCX[9];
  auVar290._8_8_ = 0;
  auVar290._0_8_ = dVar2;
  auVar982._8_8_ = 0;
  auVar982._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar982,auVar290,auVar14);
  auVar291._8_8_ = 0;
  auVar291._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar291,auVar912,auVar14);
  auVar626._8_8_ = 0;
  auVar626._0_8_ = in_R8[10];
  auVar779._8_8_ = 0;
  auVar779._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar779,auVar626,auVar14);
  dVar2 = in_RCX[10];
  auVar292._8_8_ = 0;
  auVar292._0_8_ = dVar2;
  auVar913._8_8_ = 0;
  auVar913._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar913,auVar292,auVar14);
  auVar293._8_8_ = 0;
  auVar293._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar293,auVar626,auVar14);
  auVar627._8_8_ = 0;
  auVar627._0_8_ = in_R8[0xb];
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar139,auVar627,auVar14);
  dVar1 = in_RCX[0xb];
  auVar294._8_8_ = 0;
  auVar294._0_8_ = dVar1;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar470,auVar294,auVar14);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar140,auVar627,auVar14);
  *(long *)(ctx + 0x1460) = auVar14._0_8_;
  dVar1 = *in_RCX;
  dVar2 = in_RCX[1];
  dVar3 = in_RCX[2];
  dVar4 = in_RCX[9];
  auVar780._8_8_ = 0;
  auVar780._0_8_ = dVar4;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = dVar1 * -2.0;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  auVar14 = vfmadd213sd_fma(auVar141,auVar780,auVar471);
  dVar1 = in_RCX[10];
  auVar472._8_8_ = 0;
  auVar472._0_8_ = dVar1;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar295,auVar472,auVar14);
  dVar2 = in_RCX[0xb];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = dVar2;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar628,auVar142,auVar14);
  *(double *)(ctx + 0x1528) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar781._8_8_ = 0;
  auVar781._0_8_ = *in_R9;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = dVar1 + dVar1;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = in_R9[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar629,auVar781,auVar473);
  dVar3 = in_RDX[2];
  auVar1067._8_8_ = 0;
  auVar1067._0_8_ = in_R9[2];
  auVar983._8_8_ = 0;
  auVar983._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar983,auVar1067,auVar14);
  auVar630._8_8_ = 0;
  auVar630._0_8_ = in_R9[9];
  auVar143._8_8_ = 0;
  auVar143._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar143,auVar630,auVar14);
  dVar1 = in_RDX[9];
  auVar984._8_8_ = 0;
  auVar984._0_8_ = dVar1;
  auVar782._8_8_ = 0;
  auVar782._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar782,auVar984,auVar14);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar144,auVar630,auVar14);
  auVar631._8_8_ = 0;
  auVar631._0_8_ = in_R9[10];
  auVar296._8_8_ = 0;
  auVar296._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar296,auVar631,auVar14);
  dVar1 = in_RDX[10];
  auVar145._8_8_ = 0;
  auVar145._0_8_ = dVar1;
  auVar783._8_8_ = 0;
  auVar783._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar783,auVar145,auVar14);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar146,auVar631,auVar14);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = in_R9[0xb];
  auVar474._8_8_ = 0;
  auVar474._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar474,auVar297,auVar14);
  dVar1 = in_RDX[0xb];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dVar1;
  auVar632._8_8_ = 0;
  auVar632._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar632,auVar147,auVar14);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar148,auVar297,auVar14);
  *(long *)(ctx + 0x15f0) = auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar784._8_8_ = 0;
  auVar784._0_8_ = *in_R8;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = dVar1 + dVar1;
  auVar633._8_8_ = 0;
  auVar633._0_8_ = in_R8[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar633,auVar784,auVar475);
  dVar3 = in_RDX[2];
  auVar1068._8_8_ = 0;
  auVar1068._0_8_ = in_R8[2];
  auVar985._8_8_ = 0;
  auVar985._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar985,auVar1068,auVar14);
  auVar634._8_8_ = 0;
  auVar634._0_8_ = in_R8[9];
  auVar149._8_8_ = 0;
  auVar149._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar149,auVar634,auVar14);
  dVar1 = in_RDX[9];
  auVar986._8_8_ = 0;
  auVar986._0_8_ = dVar1;
  auVar785._8_8_ = 0;
  auVar785._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar785,auVar986,auVar14);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar150,auVar634,auVar14);
  auVar635._8_8_ = 0;
  auVar635._0_8_ = in_R8[10];
  auVar298._8_8_ = 0;
  auVar298._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar298,auVar635,auVar14);
  dVar1 = in_RDX[10];
  auVar151._8_8_ = 0;
  auVar151._0_8_ = dVar1;
  auVar786._8_8_ = 0;
  auVar786._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar786,auVar151,auVar14);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar152,auVar635,auVar14);
  auVar299._8_8_ = 0;
  auVar299._0_8_ = in_R8[0xb];
  auVar476._8_8_ = 0;
  auVar476._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar476,auVar299,auVar14);
  dVar1 = in_RDX[0xb];
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar1;
  auVar636._8_8_ = 0;
  auVar636._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar636,auVar153,auVar14);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar154,auVar299,auVar14);
  *(long *)(ctx + 0x16b8) = auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  auVar787._8_8_ = 0;
  auVar787._0_8_ = *in_RCX;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = dVar1 + dVar1;
  auVar637._8_8_ = 0;
  auVar637._0_8_ = in_RCX[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar637,auVar787,auVar477);
  dVar3 = in_RDX[2];
  auVar1069._8_8_ = 0;
  auVar1069._0_8_ = in_RCX[2];
  auVar987._8_8_ = 0;
  auVar987._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar987,auVar1069,auVar14);
  auVar638._8_8_ = 0;
  auVar638._0_8_ = in_RCX[9];
  auVar155._8_8_ = 0;
  auVar155._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar155,auVar638,auVar14);
  dVar1 = in_RDX[9];
  auVar988._8_8_ = 0;
  auVar988._0_8_ = dVar1;
  auVar788._8_8_ = 0;
  auVar788._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar788,auVar988,auVar14);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar156,auVar638,auVar14);
  auVar639._8_8_ = 0;
  auVar639._0_8_ = in_RCX[10];
  auVar300._8_8_ = 0;
  auVar300._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar300,auVar639,auVar14);
  dVar1 = in_RDX[10];
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar1;
  auVar789._8_8_ = 0;
  auVar789._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar789,auVar157,auVar14);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar158,auVar639,auVar14);
  auVar301._8_8_ = 0;
  auVar301._0_8_ = in_RCX[0xb];
  auVar478._8_8_ = 0;
  auVar478._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar478,auVar301,auVar14);
  dVar1 = in_RDX[0xb];
  auVar159._8_8_ = 0;
  auVar159._0_8_ = dVar1;
  auVar640._8_8_ = 0;
  auVar640._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar640,auVar159,auVar14);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar160,auVar301,auVar14);
  *(long *)(ctx + 0x1780) = auVar14._0_8_;
  dVar1 = *in_RDX;
  dVar2 = in_RDX[1];
  dVar3 = in_RDX[2];
  dVar4 = in_RDX[9];
  auVar790._8_8_ = 0;
  auVar790._0_8_ = dVar4;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar1 * -2.0;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2;
  auVar14 = vfmadd213sd_fma(auVar161,auVar790,auVar479);
  dVar1 = in_RDX[10];
  auVar480._8_8_ = 0;
  auVar480._0_8_ = dVar1;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar302,auVar480,auVar14);
  dVar2 = in_RDX[0xb];
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar2;
  auVar641._8_8_ = 0;
  auVar641._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar641,auVar162,auVar14);
  *(double *)(ctx + 0x1848) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar791._8_8_ = 0;
  auVar791._0_8_ = *in_R9;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = dVar1 + dVar1;
  auVar642._8_8_ = 0;
  auVar642._0_8_ = in_R9[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar642,auVar791,auVar481);
  dVar3 = in_RSI[2];
  auVar1070._8_8_ = 0;
  auVar1070._0_8_ = in_R9[2];
  auVar989._8_8_ = 0;
  auVar989._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar989,auVar1070,auVar14);
  auVar643._8_8_ = 0;
  auVar643._0_8_ = in_R9[9];
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar163,auVar643,auVar14);
  dVar1 = in_RSI[9];
  auVar990._8_8_ = 0;
  auVar990._0_8_ = dVar1;
  auVar792._8_8_ = 0;
  auVar792._0_8_ = *in_R9 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar792,auVar990,auVar14);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar164,auVar643,auVar14);
  auVar644._8_8_ = 0;
  auVar644._0_8_ = in_R9[10];
  auVar303._8_8_ = 0;
  auVar303._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar303,auVar644,auVar14);
  dVar1 = in_RSI[10];
  auVar165._8_8_ = 0;
  auVar165._0_8_ = dVar1;
  auVar793._8_8_ = 0;
  auVar793._0_8_ = in_R9[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar793,auVar165,auVar14);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar166,auVar644,auVar14);
  auVar304._8_8_ = 0;
  auVar304._0_8_ = in_R9[0xb];
  auVar482._8_8_ = 0;
  auVar482._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar482,auVar304,auVar14);
  dVar1 = in_RSI[0xb];
  auVar167._8_8_ = 0;
  auVar167._0_8_ = dVar1;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = in_R9[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar645,auVar167,auVar14);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar168,auVar304,auVar14);
  *(long *)(ctx + 0x1910) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar794._8_8_ = 0;
  auVar794._0_8_ = *in_R8;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = dVar1 + dVar1;
  auVar646._8_8_ = 0;
  auVar646._0_8_ = in_R8[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar646,auVar794,auVar483);
  dVar3 = in_RSI[2];
  auVar1071._8_8_ = 0;
  auVar1071._0_8_ = in_R8[2];
  auVar991._8_8_ = 0;
  auVar991._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar991,auVar1071,auVar14);
  auVar647._8_8_ = 0;
  auVar647._0_8_ = in_R8[9];
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar169,auVar647,auVar14);
  dVar1 = in_RSI[9];
  auVar992._8_8_ = 0;
  auVar992._0_8_ = dVar1;
  auVar795._8_8_ = 0;
  auVar795._0_8_ = *in_R8 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar795,auVar992,auVar14);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar170,auVar647,auVar14);
  auVar648._8_8_ = 0;
  auVar648._0_8_ = in_R8[10];
  auVar305._8_8_ = 0;
  auVar305._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar305,auVar648,auVar14);
  dVar1 = in_RSI[10];
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar1;
  auVar796._8_8_ = 0;
  auVar796._0_8_ = in_R8[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar796,auVar171,auVar14);
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar172,auVar648,auVar14);
  auVar306._8_8_ = 0;
  auVar306._0_8_ = in_R8[0xb];
  auVar484._8_8_ = 0;
  auVar484._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar484,auVar306,auVar14);
  dVar1 = in_RSI[0xb];
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar1;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = in_R8[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar649,auVar173,auVar14);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar174,auVar306,auVar14);
  *(long *)(ctx + 0x19d8) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar797._8_8_ = 0;
  auVar797._0_8_ = *in_RCX;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = dVar1 + dVar1;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = in_RCX[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar650,auVar797,auVar485);
  dVar3 = in_RSI[2];
  auVar1072._8_8_ = 0;
  auVar1072._0_8_ = in_RCX[2];
  auVar993._8_8_ = 0;
  auVar993._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar993,auVar1072,auVar14);
  auVar651._8_8_ = 0;
  auVar651._0_8_ = in_RCX[9];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar175,auVar651,auVar14);
  dVar1 = in_RSI[9];
  auVar994._8_8_ = 0;
  auVar994._0_8_ = dVar1;
  auVar798._8_8_ = 0;
  auVar798._0_8_ = *in_RCX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar798,auVar994,auVar14);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar176,auVar651,auVar14);
  auVar652._8_8_ = 0;
  auVar652._0_8_ = in_RCX[10];
  auVar307._8_8_ = 0;
  auVar307._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar307,auVar652,auVar14);
  dVar1 = in_RSI[10];
  auVar177._8_8_ = 0;
  auVar177._0_8_ = dVar1;
  auVar799._8_8_ = 0;
  auVar799._0_8_ = in_RCX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar799,auVar177,auVar14);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar178,auVar652,auVar14);
  auVar308._8_8_ = 0;
  auVar308._0_8_ = in_RCX[0xb];
  auVar486._8_8_ = 0;
  auVar486._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar486,auVar308,auVar14);
  dVar1 = in_RSI[0xb];
  auVar179._8_8_ = 0;
  auVar179._0_8_ = dVar1;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = in_RCX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar653,auVar179,auVar14);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar180,auVar308,auVar14);
  *(long *)(ctx + 0x1aa0) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar800._8_8_ = 0;
  auVar800._0_8_ = *in_RDX;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = dVar1 + dVar1;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = in_RDX[1] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar654,auVar800,auVar487);
  dVar3 = in_RSI[2];
  auVar1073._8_8_ = 0;
  auVar1073._0_8_ = in_RDX[2];
  auVar995._8_8_ = 0;
  auVar995._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar995,auVar1073,auVar14);
  auVar655._8_8_ = 0;
  auVar655._0_8_ = in_RDX[9];
  auVar181._8_8_ = 0;
  auVar181._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar181,auVar655,auVar14);
  dVar1 = in_RSI[9];
  auVar996._8_8_ = 0;
  auVar996._0_8_ = dVar1;
  auVar801._8_8_ = 0;
  auVar801._0_8_ = *in_RDX * -2.0;
  auVar14 = vfmadd213sd_fma(auVar801,auVar996,auVar14);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar182,auVar655,auVar14);
  auVar656._8_8_ = 0;
  auVar656._0_8_ = in_RDX[10];
  auVar309._8_8_ = 0;
  auVar309._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar309,auVar656,auVar14);
  dVar1 = in_RSI[10];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar1;
  auVar802._8_8_ = 0;
  auVar802._0_8_ = in_RDX[1] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar802,auVar183,auVar14);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar184,auVar656,auVar14);
  auVar310._8_8_ = 0;
  auVar310._0_8_ = in_RDX[0xb];
  auVar488._8_8_ = 0;
  auVar488._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar488,auVar310,auVar14);
  dVar1 = in_RSI[0xb];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar1;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = in_RDX[2] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar657,auVar185,auVar14);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar186,auVar310,auVar14);
  *(long *)(ctx + 0x1b68) = auVar14._0_8_;
  dVar1 = *in_RSI;
  dVar2 = in_RSI[1];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar10 * dVar10 + auVar17._0_8_ * auVar17._0_8_ + auVar17._8_8_ * auVar17._8_8_;
  auVar14 = vsqrtsd_avx(auVar59,auVar59);
  dVar3 = in_RSI[2];
  dVar4 = in_RSI[9];
  auVar658._8_8_ = 0;
  auVar658._0_8_ = dVar4;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = (dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_) + dVar2 * dVar2 + dVar3 * dVar3;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar187,auVar658,auVar60);
  dVar1 = in_RSI[10];
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar1;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar4 * dVar4 + auVar14._0_8_;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar311,auVar188,auVar61);
  dVar2 = in_RSI[0xb];
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar2;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar1 * dVar1 + auVar14._0_8_;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar312,auVar189,auVar62);
  *(double *)(ctx + 0x1c30) = dVar2 * dVar2 + auVar14._0_8_;
  dVar1 = in_R9[3];
  dVar2 = in_R9[4];
  dVar3 = in_R9[5];
  dVar4 = in_R9[6];
  auVar659._8_8_ = 0;
  auVar659._0_8_ = dVar4;
  dVar5 = in_R9[7];
  auVar803._8_8_ = 0;
  auVar803._0_8_ = dVar5;
  dVar6 = in_R9[8];
  auVar914._8_8_ = 0;
  auVar914._0_8_ = dVar6;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar1 * -2.0;
  auVar313._8_8_ = 0;
  auVar313._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3
  ;
  auVar14 = vfmadd213sd_fma(auVar63,auVar659,auVar313);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar190,auVar803,auVar14);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar64,auVar914,auVar14);
  *(long *)(ctx + 0x1148) = auVar14._0_8_;
  dVar1 = in_R8[3];
  dVar2 = in_R8[4];
  auVar660._8_8_ = 0;
  auVar660._0_8_ = in_R9[3];
  auVar314._8_8_ = 0;
  auVar314._0_8_ = dVar1 + dVar1;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = in_R9[4] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar489,auVar660,auVar314);
  auVar315._8_8_ = 0;
  auVar315._0_8_ = in_R9[7];
  auVar191._8_8_ = 0;
  auVar191._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar191,auVar315,auVar14);
  dVar2 = in_R8[7];
  auVar490._8_8_ = 0;
  auVar490._0_8_ = dVar2;
  auVar804._8_8_ = 0;
  auVar804._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar804,auVar490,auVar14);
  dVar3 = in_R8[5];
  auVar997._8_8_ = 0;
  auVar997._0_8_ = in_R9[5];
  auVar915._8_8_ = 0;
  auVar915._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar915,auVar997,auVar14);
  dVar4 = in_R8[6];
  auVar805._8_8_ = 0;
  auVar805._0_8_ = dVar4;
  auVar1125._8_8_ = 0;
  auVar1125._0_8_ = in_R9[6];
  auVar1074._8_8_ = 0;
  auVar1074._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1074,auVar1125,auVar14);
  auVar491._8_8_ = 0;
  auVar491._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar491,auVar315,auVar14);
  dVar2 = in_R8[8];
  auVar316._8_8_ = 0;
  auVar316._0_8_ = dVar2;
  auVar1075._8_8_ = 0;
  auVar1075._0_8_ = in_R9[8];
  auVar916._8_8_ = 0;
  auVar916._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar916,auVar1075,auVar14);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar65,auVar1125,auVar14);
  auVar492._8_8_ = 0;
  auVar492._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar492,auVar805,auVar14);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar66,auVar1075,auVar14);
  auVar192._8_8_ = 0;
  auVar192._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar192,auVar316,auVar14);
  *(long *)(ctx + 0x1210) = auVar14._0_8_;
  dVar1 = in_R8[3];
  dVar2 = in_R8[4];
  dVar3 = in_R8[5];
  dVar4 = in_R8[6];
  auVar661._8_8_ = 0;
  auVar661._0_8_ = dVar4;
  dVar5 = in_R8[7];
  auVar806._8_8_ = 0;
  auVar806._0_8_ = dVar5;
  dVar6 = in_R8[8];
  auVar917._8_8_ = 0;
  auVar917._0_8_ = dVar6;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1 * -2.0;
  auVar317._8_8_ = 0;
  auVar317._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3
  ;
  auVar14 = vfmadd213sd_fma(auVar67,auVar661,auVar317);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar193,auVar806,auVar14);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar68,auVar917,auVar14);
  *(long *)(ctx + 0x12d8) = auVar14._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  auVar662._8_8_ = 0;
  auVar662._0_8_ = in_R9[3];
  auVar318._8_8_ = 0;
  auVar318._0_8_ = dVar1 + dVar1;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = in_R9[4] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar493,auVar662,auVar318);
  auVar319._8_8_ = 0;
  auVar319._0_8_ = in_R9[7];
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar194,auVar319,auVar14);
  dVar2 = in_RCX[7];
  auVar494._8_8_ = 0;
  auVar494._0_8_ = dVar2;
  auVar807._8_8_ = 0;
  auVar807._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar807,auVar494,auVar14);
  dVar3 = in_RCX[5];
  auVar998._8_8_ = 0;
  auVar998._0_8_ = in_R9[5];
  auVar918._8_8_ = 0;
  auVar918._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar918,auVar998,auVar14);
  dVar4 = in_RCX[6];
  auVar808._8_8_ = 0;
  auVar808._0_8_ = dVar4;
  auVar1126._8_8_ = 0;
  auVar1126._0_8_ = in_R9[6];
  auVar1076._8_8_ = 0;
  auVar1076._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1076,auVar1126,auVar14);
  auVar495._8_8_ = 0;
  auVar495._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar495,auVar319,auVar14);
  dVar2 = in_RCX[8];
  auVar320._8_8_ = 0;
  auVar320._0_8_ = dVar2;
  auVar1077._8_8_ = 0;
  auVar1077._0_8_ = in_R9[8];
  auVar919._8_8_ = 0;
  auVar919._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar919,auVar1077,auVar14);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar69,auVar1126,auVar14);
  auVar496._8_8_ = 0;
  auVar496._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar496,auVar808,auVar14);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar70,auVar1077,auVar14);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar195,auVar320,auVar14);
  *(long *)(ctx + 0x13a0) = auVar14._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  auVar663._8_8_ = 0;
  auVar663._0_8_ = in_R8[3];
  auVar321._8_8_ = 0;
  auVar321._0_8_ = dVar1 + dVar1;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = in_R8[4] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar497,auVar663,auVar321);
  auVar322._8_8_ = 0;
  auVar322._0_8_ = in_R8[7];
  auVar196._8_8_ = 0;
  auVar196._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar196,auVar322,auVar14);
  dVar2 = in_RCX[7];
  auVar498._8_8_ = 0;
  auVar498._0_8_ = dVar2;
  auVar809._8_8_ = 0;
  auVar809._0_8_ = in_R8[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar809,auVar498,auVar14);
  dVar3 = in_RCX[5];
  auVar999._8_8_ = 0;
  auVar999._0_8_ = in_R8[5];
  auVar920._8_8_ = 0;
  auVar920._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar920,auVar999,auVar14);
  dVar4 = in_RCX[6];
  auVar810._8_8_ = 0;
  auVar810._0_8_ = dVar4;
  auVar1127._8_8_ = 0;
  auVar1127._0_8_ = in_R8[6];
  auVar1078._8_8_ = 0;
  auVar1078._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1078,auVar1127,auVar14);
  auVar499._8_8_ = 0;
  auVar499._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar499,auVar322,auVar14);
  dVar2 = in_RCX[8];
  auVar323._8_8_ = 0;
  auVar323._0_8_ = dVar2;
  auVar1079._8_8_ = 0;
  auVar1079._0_8_ = in_R8[8];
  auVar921._8_8_ = 0;
  auVar921._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar921,auVar1079,auVar14);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar71,auVar1127,auVar14);
  auVar500._8_8_ = 0;
  auVar500._0_8_ = in_R8[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar500,auVar810,auVar14);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar72,auVar1079,auVar14);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = in_R8[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar197,auVar323,auVar14);
  *(long *)(ctx + 0x1468) = auVar14._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  dVar3 = in_RCX[5];
  dVar4 = in_RCX[6];
  auVar664._8_8_ = 0;
  auVar664._0_8_ = dVar4;
  dVar5 = in_RCX[7];
  auVar811._8_8_ = 0;
  auVar811._0_8_ = dVar5;
  dVar6 = in_RCX[8];
  auVar922._8_8_ = 0;
  auVar922._0_8_ = dVar6;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar1 * -2.0;
  auVar324._8_8_ = 0;
  auVar324._0_8_ =
       dVar6 * dVar6 + dVar5 * dVar5 + dVar4 * dVar4 + dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3
  ;
  auVar14 = vfmadd213sd_fma(auVar73,auVar664,auVar324);
  auVar198._8_8_ = 0;
  auVar198._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar198,auVar811,auVar14);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar74,auVar922,auVar14);
  *(long *)(ctx + 0x1530) = auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar665._8_8_ = 0;
  auVar665._0_8_ = in_R9[3];
  auVar325._8_8_ = 0;
  auVar325._0_8_ = dVar1 + dVar1;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = in_R9[4] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar501,auVar665,auVar325);
  dVar3 = in_RDX[7];
  auVar326._8_8_ = 0;
  auVar326._0_8_ = dVar3;
  auVar812._8_8_ = 0;
  auVar812._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar812,auVar326,auVar14);
  dVar4 = in_RDX[5];
  auVar1000._8_8_ = 0;
  auVar1000._0_8_ = in_R9[5];
  auVar923._8_8_ = 0;
  auVar923._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar923,auVar1000,auVar14);
  dVar5 = in_RDX[6];
  auVar813._8_8_ = 0;
  auVar813._0_8_ = dVar5;
  auVar1128._8_8_ = 0;
  auVar1128._0_8_ = in_R9[6];
  auVar1080._8_8_ = 0;
  auVar1080._0_8_ = dVar5 + dVar5;
  auVar14 = vfmadd213sd_fma(auVar1080,auVar1128,auVar14);
  auVar924._8_8_ = 0;
  auVar924._0_8_ = in_R9[7];
  auVar327._8_8_ = 0;
  auVar327._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar327,auVar924,auVar14);
  dVar3 = in_RDX[8];
  auVar1081._8_8_ = 0;
  auVar1081._0_8_ = dVar3;
  auVar1167._8_8_ = 0;
  auVar1167._0_8_ = in_R9[8];
  auVar1151._8_8_ = 0;
  auVar1151._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1151,auVar1167,auVar14);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar75,auVar1128,auVar14);
  auVar328._8_8_ = 0;
  auVar328._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar328,auVar813,auVar14);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar76,auVar924,auVar14);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar199,auVar1167,auVar14);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar77,auVar1081,auVar14);
  *(long *)(ctx + 0x15f8) = auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar666._8_8_ = 0;
  auVar666._0_8_ = in_R8[3];
  auVar329._8_8_ = 0;
  auVar329._0_8_ = dVar1 + dVar1;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = in_R8[4] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar502,auVar666,auVar329);
  dVar3 = in_RDX[7];
  auVar330._8_8_ = 0;
  auVar330._0_8_ = dVar3;
  auVar814._8_8_ = 0;
  auVar814._0_8_ = in_R8[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar814,auVar330,auVar14);
  dVar4 = in_RDX[5];
  auVar1001._8_8_ = 0;
  auVar1001._0_8_ = in_R8[5];
  auVar925._8_8_ = 0;
  auVar925._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar925,auVar1001,auVar14);
  dVar5 = in_RDX[6];
  auVar815._8_8_ = 0;
  auVar815._0_8_ = dVar5;
  auVar1129._8_8_ = 0;
  auVar1129._0_8_ = in_R8[6];
  auVar1082._8_8_ = 0;
  auVar1082._0_8_ = dVar5 + dVar5;
  auVar14 = vfmadd213sd_fma(auVar1082,auVar1129,auVar14);
  auVar926._8_8_ = 0;
  auVar926._0_8_ = in_R8[7];
  auVar331._8_8_ = 0;
  auVar331._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar331,auVar926,auVar14);
  dVar3 = in_RDX[8];
  auVar1083._8_8_ = 0;
  auVar1083._0_8_ = dVar3;
  auVar1168._8_8_ = 0;
  auVar1168._0_8_ = in_R8[8];
  auVar1152._8_8_ = 0;
  auVar1152._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1152,auVar1168,auVar14);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar78,auVar1129,auVar14);
  auVar332._8_8_ = 0;
  auVar332._0_8_ = in_R8[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar332,auVar815,auVar14);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar79,auVar926,auVar14);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar200,auVar1168,auVar14);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = in_R8[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar80,auVar1083,auVar14);
  *(long *)(ctx + 0x16c0) = auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar667._8_8_ = 0;
  auVar667._0_8_ = in_RCX[3];
  auVar333._8_8_ = 0;
  auVar333._0_8_ = dVar1 + dVar1;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = in_RCX[4] * (dVar2 + dVar2);
  auVar14 = vfmadd231sd_fma(auVar503,auVar667,auVar333);
  dVar3 = in_RDX[7];
  auVar334._8_8_ = 0;
  auVar334._0_8_ = dVar3;
  auVar816._8_8_ = 0;
  auVar816._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar816,auVar334,auVar14);
  dVar4 = in_RDX[5];
  auVar1002._8_8_ = 0;
  auVar1002._0_8_ = in_RCX[5];
  auVar927._8_8_ = 0;
  auVar927._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar927,auVar1002,auVar14);
  dVar5 = in_RDX[6];
  auVar817._8_8_ = 0;
  auVar817._0_8_ = dVar5;
  auVar1130._8_8_ = 0;
  auVar1130._0_8_ = in_RCX[6];
  auVar1084._8_8_ = 0;
  auVar1084._0_8_ = dVar5 + dVar5;
  auVar14 = vfmadd213sd_fma(auVar1084,auVar1130,auVar14);
  auVar928._8_8_ = 0;
  auVar928._0_8_ = in_RCX[7];
  auVar335._8_8_ = 0;
  auVar335._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar335,auVar928,auVar14);
  dVar3 = in_RDX[8];
  auVar1085._8_8_ = 0;
  auVar1085._0_8_ = dVar3;
  auVar1169._8_8_ = 0;
  auVar1169._0_8_ = in_RCX[8];
  auVar1153._8_8_ = 0;
  auVar1153._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1153,auVar1169,auVar14);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar81,auVar1130,auVar14);
  auVar336._8_8_ = 0;
  auVar336._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar336,auVar817,auVar14);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar82,auVar928,auVar14);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = dVar4 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar201,auVar1169,auVar14);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar83,auVar1085,auVar14);
  *(long *)(ctx + 0x1788) = auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  dVar3 = in_RDX[6];
  auVar504._8_8_ = 0;
  auVar504._0_8_ = dVar3;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar1 * dVar1;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd231sd_fma(auVar84,auVar504,auVar337);
  dVar1 = in_RDX[5];
  dVar4 = in_RDX[7];
  auVar505._8_8_ = 0;
  auVar505._0_8_ = dVar4;
  dVar5 = in_RDX[8];
  auVar668._8_8_ = 0;
  auVar668._0_8_ = dVar5;
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       dVar5 * dVar5 + dVar4 * dVar4 + dVar3 * dVar3 + auVar14._0_8_ + dVar2 * dVar2 + dVar1 * dVar1
  ;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar202,auVar505,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar86,auVar668,auVar14);
  *(long *)(ctx + 0x1850) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar506._8_8_ = 0;
  auVar506._0_8_ = in_R9[6];
  auVar818._8_8_ = 0;
  auVar818._0_8_ = in_R9[4];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = (dVar1 + dVar1) * in_R9[3];
  auVar338._8_8_ = 0;
  auVar338._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd231sd_fma(auVar87,auVar506,auVar338);
  auVar339._8_8_ = 0;
  auVar339._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar339,auVar818,auVar14);
  dVar1 = in_RSI[5];
  auVar1003._8_8_ = 0;
  auVar1003._0_8_ = in_R9[5];
  auVar929._8_8_ = 0;
  auVar929._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar929,auVar1003,auVar14);
  dVar3 = in_RSI[6];
  auVar340._8_8_ = 0;
  auVar340._0_8_ = dVar3;
  auVar1086._8_8_ = 0;
  auVar1086._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1086,auVar506,auVar14);
  dVar3 = in_RSI[7];
  auVar507._8_8_ = 0;
  auVar507._0_8_ = dVar3;
  auVar1131._8_8_ = 0;
  auVar1131._0_8_ = in_R9[7];
  auVar930._8_8_ = 0;
  auVar930._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar930,auVar1131,auVar14);
  dVar3 = in_RSI[8];
  auVar1087._8_8_ = 0;
  auVar1087._0_8_ = dVar3;
  auVar1170._8_8_ = 0;
  auVar1170._0_8_ = in_R9[8];
  auVar1154._8_8_ = 0;
  auVar1154._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1154,auVar1170,auVar14);
  auVar669._8_8_ = 0;
  auVar669._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar669,auVar340,auVar14);
  auVar203._8_8_ = 0;
  auVar203._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar203,auVar1131,auVar14);
  auVar341._8_8_ = 0;
  auVar341._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar341,auVar507,auVar14);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar88,auVar1170,auVar14);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar204,auVar1087,auVar14);
  *(long *)(ctx + 0x1918) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar508._8_8_ = 0;
  auVar508._0_8_ = in_R8[6];
  auVar819._8_8_ = 0;
  auVar819._0_8_ = in_R8[4];
  auVar89._8_8_ = 0;
  auVar89._0_8_ = (dVar1 + dVar1) * in_R8[3];
  auVar342._8_8_ = 0;
  auVar342._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd231sd_fma(auVar89,auVar508,auVar342);
  auVar343._8_8_ = 0;
  auVar343._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar343,auVar819,auVar14);
  dVar1 = in_RSI[5];
  auVar1004._8_8_ = 0;
  auVar1004._0_8_ = in_R8[5];
  auVar931._8_8_ = 0;
  auVar931._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar931,auVar1004,auVar14);
  dVar3 = in_RSI[6];
  auVar344._8_8_ = 0;
  auVar344._0_8_ = dVar3;
  auVar1088._8_8_ = 0;
  auVar1088._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1088,auVar508,auVar14);
  dVar3 = in_RSI[7];
  auVar509._8_8_ = 0;
  auVar509._0_8_ = dVar3;
  auVar1132._8_8_ = 0;
  auVar1132._0_8_ = in_R8[7];
  auVar932._8_8_ = 0;
  auVar932._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar932,auVar1132,auVar14);
  dVar3 = in_RSI[8];
  auVar1089._8_8_ = 0;
  auVar1089._0_8_ = dVar3;
  auVar1171._8_8_ = 0;
  auVar1171._0_8_ = in_R8[8];
  auVar1155._8_8_ = 0;
  auVar1155._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1155,auVar1171,auVar14);
  auVar670._8_8_ = 0;
  auVar670._0_8_ = in_R8[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar670,auVar344,auVar14);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar205,auVar1132,auVar14);
  auVar345._8_8_ = 0;
  auVar345._0_8_ = in_R8[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar345,auVar509,auVar14);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar90,auVar1171,auVar14);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = in_R8[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar206,auVar1089,auVar14);
  *(long *)(ctx + 0x19e0) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar510._8_8_ = 0;
  auVar510._0_8_ = in_RCX[6];
  auVar820._8_8_ = 0;
  auVar820._0_8_ = in_RCX[4];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (dVar1 + dVar1) * in_RCX[3];
  auVar346._8_8_ = 0;
  auVar346._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd231sd_fma(auVar91,auVar510,auVar346);
  auVar347._8_8_ = 0;
  auVar347._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar347,auVar820,auVar14);
  dVar1 = in_RSI[5];
  auVar1005._8_8_ = 0;
  auVar1005._0_8_ = in_RCX[5];
  auVar933._8_8_ = 0;
  auVar933._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar933,auVar1005,auVar14);
  dVar3 = in_RSI[6];
  auVar348._8_8_ = 0;
  auVar348._0_8_ = dVar3;
  auVar1090._8_8_ = 0;
  auVar1090._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1090,auVar510,auVar14);
  dVar3 = in_RSI[7];
  auVar511._8_8_ = 0;
  auVar511._0_8_ = dVar3;
  auVar1133._8_8_ = 0;
  auVar1133._0_8_ = in_RCX[7];
  auVar934._8_8_ = 0;
  auVar934._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar934,auVar1133,auVar14);
  dVar3 = in_RSI[8];
  auVar1091._8_8_ = 0;
  auVar1091._0_8_ = dVar3;
  auVar1172._8_8_ = 0;
  auVar1172._0_8_ = in_RCX[8];
  auVar1156._8_8_ = 0;
  auVar1156._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar1156,auVar1172,auVar14);
  auVar671._8_8_ = 0;
  auVar671._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar671,auVar348,auVar14);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar207,auVar1133,auVar14);
  auVar349._8_8_ = 0;
  auVar349._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar349,auVar511,auVar14);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar92,auVar1172,auVar14);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar208,auVar1091,auVar14);
  *(long *)(ctx + 0x1aa8) = auVar14._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = in_RDX[3];
  auVar209._8_8_ = 0;
  auVar209._0_8_ = in_RDX[4];
  dVar1 = in_RSI[6];
  auVar512._8_8_ = 0;
  auVar512._0_8_ = dVar1;
  auVar672._8_8_ = 0;
  auVar672._0_8_ = in_RDX[6];
  dVar2 = in_RSI[3];
  dVar3 = in_RSI[4];
  auVar350._8_8_ = 0;
  auVar350._0_8_ = in_RDX[3] * -2.0;
  auVar1006._8_8_ = 0;
  auVar1006._0_8_ = dVar2 * -2.0 * in_RDX[6];
  auVar14 = vfmadd231sd_fma(auVar1006,auVar512,auVar350);
  auVar351._8_8_ = 0;
  auVar351._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar351,auVar93,auVar14);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar94,auVar209,auVar14);
  dVar2 = in_RSI[5];
  auVar1007._8_8_ = 0;
  auVar1007._0_8_ = in_RDX[5];
  auVar821._8_8_ = 0;
  auVar821._0_8_ = dVar2 + dVar2;
  auVar14 = vfmadd213sd_fma(auVar821,auVar1007,auVar14);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar95,auVar672,auVar14);
  dVar1 = in_RSI[7];
  auVar513._8_8_ = 0;
  auVar513._0_8_ = dVar1;
  auVar822._8_8_ = 0;
  auVar822._0_8_ = in_RDX[7];
  auVar673._8_8_ = 0;
  auVar673._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar673,auVar822,auVar14);
  dVar1 = in_RSI[8];
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar1;
  auVar1134._8_8_ = 0;
  auVar1134._0_8_ = in_RDX[8];
  auVar1092._8_8_ = 0;
  auVar1092._0_8_ = dVar1 + dVar1;
  auVar14 = vfmadd213sd_fma(auVar1092,auVar1134,auVar14);
  auVar674._8_8_ = 0;
  auVar674._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar674,auVar822,auVar14);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = in_RDX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar210,auVar513,auVar14);
  auVar352._8_8_ = 0;
  auVar352._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar352,auVar1134,auVar14);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = in_RDX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar211,auVar96,auVar14);
  *(long *)(ctx + 0x1b70) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar11 * dVar11 + auVar18._0_8_ * auVar18._0_8_ + auVar18._8_8_ * auVar18._8_8_;
  auVar14 = vsqrtsd_avx(auVar17,auVar17);
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[6];
  auVar514._8_8_ = 0;
  auVar514._0_8_ = dVar4;
  dVar5 = in_RSI[7];
  auVar675._8_8_ = 0;
  auVar675._0_8_ = dVar5;
  dVar6 = in_RSI[8];
  auVar823._8_8_ = 0;
  auVar823._0_8_ = dVar6;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       dVar6 * dVar6 +
       dVar5 * dVar5 +
       (dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
       dVar4 * dVar4;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar97,auVar514,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar19,auVar675,auVar14);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar98,auVar823,auVar14);
  *(long *)(ctx + 0x1c38) = auVar14._0_8_;
  dVar1 = in_R9[3];
  dVar2 = in_R9[4];
  dVar3 = in_R9[5];
  dVar4 = in_R9[9];
  auVar515._8_8_ = 0;
  auVar515._0_8_ = dVar4;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 * -2.0;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3;
  auVar14 = vfmadd213sd_fma(auVar20,auVar515,auVar212);
  dVar1 = in_R9[10];
  auVar213._8_8_ = 0;
  auVar213._0_8_ = dVar1;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar99,auVar213,auVar14);
  dVar2 = in_R9[0xb];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar353,auVar21,auVar14);
  *(double *)(ctx + 0x1150) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = in_R8[3];
  dVar2 = in_R8[4];
  auVar516._8_8_ = 0;
  auVar516._0_8_ = in_R9[3];
  auVar214._8_8_ = 0;
  auVar214._0_8_ = dVar1 + dVar1;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = (dVar2 + dVar2) * in_R9[4];
  auVar14 = vfmadd231sd_fma(auVar354,auVar516,auVar214);
  dVar3 = in_R8[5];
  auVar935._8_8_ = 0;
  auVar935._0_8_ = in_R9[5];
  auVar824._8_8_ = 0;
  auVar824._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar824,auVar935,auVar14);
  dVar4 = in_R8[9];
  auVar355._8_8_ = 0;
  auVar355._0_8_ = dVar4;
  auVar1093._8_8_ = 0;
  auVar1093._0_8_ = in_R9[9];
  auVar1008._8_8_ = 0;
  auVar1008._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1008,auVar1093,auVar14);
  dVar4 = in_R8[10];
  auVar825._8_8_ = 0;
  auVar825._0_8_ = dVar4;
  auVar1157._8_8_ = 0;
  auVar1157._0_8_ = in_R9[10];
  auVar1135._8_8_ = 0;
  auVar1135._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1135,auVar1157,auVar14);
  dVar4 = in_R8[0xb];
  auVar1009._8_8_ = 0;
  auVar1009._0_8_ = dVar4;
  auVar1183._8_8_ = 0;
  auVar1183._0_8_ = in_R9[0xb];
  auVar1173._8_8_ = 0;
  auVar1173._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1173,auVar1183,auVar14);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar22,auVar1093,auVar14);
  auVar517._8_8_ = 0;
  auVar517._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar517,auVar355,auVar14);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar23,auVar1157,auVar14);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar100,auVar825,auVar14);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar24,auVar1183,auVar14);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar101,auVar1009,auVar14);
  *(long *)(ctx + 0x1218) = auVar14._0_8_;
  dVar1 = in_R8[3];
  dVar2 = in_R8[4];
  dVar3 = in_R8[5];
  dVar4 = in_R8[9];
  auVar518._8_8_ = 0;
  auVar518._0_8_ = dVar4;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1 * -2.0;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3;
  auVar14 = vfmadd213sd_fma(auVar25,auVar518,auVar215);
  dVar1 = in_R8[10];
  auVar216._8_8_ = 0;
  auVar216._0_8_ = dVar1;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar102,auVar216,auVar14);
  dVar2 = in_R8[0xb];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar2;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar356,auVar26,auVar14);
  *(double *)(ctx + 0x12e0) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  auVar519._8_8_ = 0;
  auVar519._0_8_ = in_R9[3];
  auVar217._8_8_ = 0;
  auVar217._0_8_ = dVar1 + dVar1;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = (dVar2 + dVar2) * in_R9[4];
  auVar14 = vfmadd231sd_fma(auVar357,auVar519,auVar217);
  dVar3 = in_RCX[5];
  auVar936._8_8_ = 0;
  auVar936._0_8_ = in_R9[5];
  auVar826._8_8_ = 0;
  auVar826._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar826,auVar936,auVar14);
  dVar4 = in_RCX[9];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = dVar4;
  auVar1094._8_8_ = 0;
  auVar1094._0_8_ = in_R9[9];
  auVar1010._8_8_ = 0;
  auVar1010._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1010,auVar1094,auVar14);
  dVar4 = in_RCX[10];
  auVar827._8_8_ = 0;
  auVar827._0_8_ = dVar4;
  auVar1158._8_8_ = 0;
  auVar1158._0_8_ = in_R9[10];
  auVar1136._8_8_ = 0;
  auVar1136._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1136,auVar1158,auVar14);
  dVar4 = in_RCX[0xb];
  auVar1011._8_8_ = 0;
  auVar1011._0_8_ = dVar4;
  auVar1184._8_8_ = 0;
  auVar1184._0_8_ = in_R9[0xb];
  auVar1174._8_8_ = 0;
  auVar1174._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1174,auVar1184,auVar14);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar27,auVar1094,auVar14);
  auVar520._8_8_ = 0;
  auVar520._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar520,auVar358,auVar14);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar28,auVar1158,auVar14);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar103,auVar827,auVar14);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar29,auVar1184,auVar14);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar104,auVar1011,auVar14);
  *(long *)(ctx + 0x13a8) = auVar14._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  auVar521._8_8_ = 0;
  auVar521._0_8_ = in_R8[3];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = dVar1 + dVar1;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = (dVar2 + dVar2) * in_R8[4];
  auVar14 = vfmadd231sd_fma(auVar359,auVar521,auVar218);
  dVar3 = in_RCX[5];
  auVar937._8_8_ = 0;
  auVar937._0_8_ = in_R8[5];
  auVar828._8_8_ = 0;
  auVar828._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar828,auVar937,auVar14);
  dVar4 = in_RCX[9];
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar4;
  auVar1095._8_8_ = 0;
  auVar1095._0_8_ = in_R8[9];
  auVar1012._8_8_ = 0;
  auVar1012._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1012,auVar1095,auVar14);
  dVar4 = in_RCX[10];
  auVar829._8_8_ = 0;
  auVar829._0_8_ = dVar4;
  auVar1159._8_8_ = 0;
  auVar1159._0_8_ = in_R8[10];
  auVar1137._8_8_ = 0;
  auVar1137._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1137,auVar1159,auVar14);
  dVar4 = in_RCX[0xb];
  auVar1013._8_8_ = 0;
  auVar1013._0_8_ = dVar4;
  auVar1185._8_8_ = 0;
  auVar1185._0_8_ = in_R8[0xb];
  auVar1175._8_8_ = 0;
  auVar1175._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1175,auVar1185,auVar14);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar30,auVar1095,auVar14);
  auVar522._8_8_ = 0;
  auVar522._0_8_ = in_R8[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar522,auVar360,auVar14);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar31,auVar1159,auVar14);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = in_R8[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar105,auVar829,auVar14);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar32,auVar1185,auVar14);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = in_R8[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar106,auVar1013,auVar14);
  *(long *)(ctx + 0x1470) = auVar14._0_8_;
  dVar1 = in_RCX[3];
  dVar2 = in_RCX[4];
  dVar3 = in_RCX[5];
  dVar4 = in_RCX[9];
  auVar523._8_8_ = 0;
  auVar523._0_8_ = dVar4;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar1 * -2.0;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3;
  auVar14 = vfmadd213sd_fma(auVar33,auVar523,auVar219);
  dVar1 = in_RCX[10];
  auVar220._8_8_ = 0;
  auVar220._0_8_ = dVar1;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar107,auVar220,auVar14);
  dVar2 = in_RCX[0xb];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar2;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar361,auVar34,auVar14);
  *(double *)(ctx + 0x1538) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar524._8_8_ = 0;
  auVar524._0_8_ = in_R9[3];
  auVar221._8_8_ = 0;
  auVar221._0_8_ = dVar1 + dVar1;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = (dVar2 + dVar2) * in_R9[4];
  auVar14 = vfmadd231sd_fma(auVar362,auVar524,auVar221);
  dVar3 = in_RDX[5];
  auVar938._8_8_ = 0;
  auVar938._0_8_ = in_R9[5];
  auVar830._8_8_ = 0;
  auVar830._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar830,auVar938,auVar14);
  dVar4 = in_RDX[9];
  auVar363._8_8_ = 0;
  auVar363._0_8_ = dVar4;
  auVar1096._8_8_ = 0;
  auVar1096._0_8_ = in_R9[9];
  auVar1014._8_8_ = 0;
  auVar1014._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1014,auVar1096,auVar14);
  dVar4 = in_RDX[10];
  auVar831._8_8_ = 0;
  auVar831._0_8_ = dVar4;
  auVar1160._8_8_ = 0;
  auVar1160._0_8_ = in_R9[10];
  auVar1138._8_8_ = 0;
  auVar1138._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1138,auVar1160,auVar14);
  dVar4 = in_RDX[0xb];
  auVar1015._8_8_ = 0;
  auVar1015._0_8_ = dVar4;
  auVar1186._8_8_ = 0;
  auVar1186._0_8_ = in_R9[0xb];
  auVar1176._8_8_ = 0;
  auVar1176._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1176,auVar1186,auVar14);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar35,auVar1096,auVar14);
  auVar525._8_8_ = 0;
  auVar525._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar525,auVar363,auVar14);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar36,auVar1160,auVar14);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar108,auVar831,auVar14);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar37,auVar1186,auVar14);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar109,auVar1015,auVar14);
  *(long *)(ctx + 0x1600) = auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar526._8_8_ = 0;
  auVar526._0_8_ = in_R8[3];
  auVar222._8_8_ = 0;
  auVar222._0_8_ = dVar1 + dVar1;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = (dVar2 + dVar2) * in_R8[4];
  auVar14 = vfmadd231sd_fma(auVar364,auVar526,auVar222);
  dVar3 = in_RDX[5];
  auVar939._8_8_ = 0;
  auVar939._0_8_ = in_R8[5];
  auVar832._8_8_ = 0;
  auVar832._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar832,auVar939,auVar14);
  dVar4 = in_RDX[9];
  auVar365._8_8_ = 0;
  auVar365._0_8_ = dVar4;
  auVar1097._8_8_ = 0;
  auVar1097._0_8_ = in_R8[9];
  auVar1016._8_8_ = 0;
  auVar1016._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1016,auVar1097,auVar14);
  dVar4 = in_RDX[10];
  auVar833._8_8_ = 0;
  auVar833._0_8_ = dVar4;
  auVar1161._8_8_ = 0;
  auVar1161._0_8_ = in_R8[10];
  auVar1139._8_8_ = 0;
  auVar1139._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1139,auVar1161,auVar14);
  dVar4 = in_RDX[0xb];
  auVar1017._8_8_ = 0;
  auVar1017._0_8_ = dVar4;
  auVar1187._8_8_ = 0;
  auVar1187._0_8_ = in_R8[0xb];
  auVar1177._8_8_ = 0;
  auVar1177._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1177,auVar1187,auVar14);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar38,auVar1097,auVar14);
  auVar527._8_8_ = 0;
  auVar527._0_8_ = in_R8[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar527,auVar365,auVar14);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar39,auVar1161,auVar14);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = in_R8[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar110,auVar833,auVar14);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar40,auVar1187,auVar14);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = in_R8[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar111,auVar1017,auVar14);
  *(long *)(ctx + 0x16c8) = auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  auVar528._8_8_ = 0;
  auVar528._0_8_ = in_RCX[3];
  auVar223._8_8_ = 0;
  auVar223._0_8_ = dVar1 + dVar1;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = (dVar2 + dVar2) * in_RCX[4];
  auVar14 = vfmadd231sd_fma(auVar366,auVar528,auVar223);
  dVar3 = in_RDX[5];
  auVar940._8_8_ = 0;
  auVar940._0_8_ = in_RCX[5];
  auVar834._8_8_ = 0;
  auVar834._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar834,auVar940,auVar14);
  dVar4 = in_RDX[9];
  auVar367._8_8_ = 0;
  auVar367._0_8_ = dVar4;
  auVar1098._8_8_ = 0;
  auVar1098._0_8_ = in_RCX[9];
  auVar1018._8_8_ = 0;
  auVar1018._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1018,auVar1098,auVar14);
  dVar4 = in_RDX[10];
  auVar835._8_8_ = 0;
  auVar835._0_8_ = dVar4;
  auVar1162._8_8_ = 0;
  auVar1162._0_8_ = in_RCX[10];
  auVar1140._8_8_ = 0;
  auVar1140._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1140,auVar1162,auVar14);
  dVar4 = in_RDX[0xb];
  auVar1019._8_8_ = 0;
  auVar1019._0_8_ = dVar4;
  auVar1188._8_8_ = 0;
  auVar1188._0_8_ = in_RCX[0xb];
  auVar1178._8_8_ = 0;
  auVar1178._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1178,auVar1188,auVar14);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar41,auVar1098,auVar14);
  auVar529._8_8_ = 0;
  auVar529._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar529,auVar367,auVar14);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar42,auVar1162,auVar14);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar112,auVar835,auVar14);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar43,auVar1188,auVar14);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar113,auVar1019,auVar14);
  *(long *)(ctx + 0x1790) = auVar14._0_8_;
  dVar1 = in_RDX[3];
  dVar2 = in_RDX[4];
  dVar3 = in_RDX[5];
  dVar4 = in_RDX[9];
  auVar530._8_8_ = 0;
  auVar530._0_8_ = dVar4;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1 * -2.0;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = dVar1 * dVar1 + dVar2 * dVar2 + dVar3 * dVar3;
  auVar14 = vfmadd213sd_fma(auVar44,auVar530,auVar224);
  dVar1 = in_RDX[10];
  auVar225._8_8_ = 0;
  auVar225._0_8_ = dVar1;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar114,auVar225,auVar14);
  dVar2 = in_RDX[0xb];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar2;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar368,auVar45,auVar14);
  *(double *)(ctx + 0x1858) = dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4 + auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar531._8_8_ = 0;
  auVar531._0_8_ = in_R9[3];
  auVar226._8_8_ = 0;
  auVar226._0_8_ = dVar1 + dVar1;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = (dVar2 + dVar2) * in_R9[4];
  auVar14 = vfmadd231sd_fma(auVar369,auVar531,auVar226);
  dVar3 = in_RSI[5];
  auVar941._8_8_ = 0;
  auVar941._0_8_ = in_R9[5];
  auVar836._8_8_ = 0;
  auVar836._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar836,auVar941,auVar14);
  dVar4 = in_RSI[9];
  auVar370._8_8_ = 0;
  auVar370._0_8_ = dVar4;
  auVar1099._8_8_ = 0;
  auVar1099._0_8_ = in_R9[9];
  auVar1020._8_8_ = 0;
  auVar1020._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1020,auVar1099,auVar14);
  dVar4 = in_RSI[10];
  auVar837._8_8_ = 0;
  auVar837._0_8_ = dVar4;
  auVar1163._8_8_ = 0;
  auVar1163._0_8_ = in_R9[10];
  auVar1141._8_8_ = 0;
  auVar1141._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1141,auVar1163,auVar14);
  dVar4 = in_RSI[0xb];
  auVar1021._8_8_ = 0;
  auVar1021._0_8_ = dVar4;
  auVar1189._8_8_ = 0;
  auVar1189._0_8_ = in_R9[0xb];
  auVar1179._8_8_ = 0;
  auVar1179._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1179,auVar1189,auVar14);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar46,auVar1099,auVar14);
  auVar532._8_8_ = 0;
  auVar532._0_8_ = in_R9[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar532,auVar370,auVar14);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar47,auVar1163,auVar14);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = in_R9[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar115,auVar837,auVar14);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar48,auVar1189,auVar14);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = in_R9[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar116,auVar1021,auVar14);
  *(long *)(ctx + 0x1920) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar533._8_8_ = 0;
  auVar533._0_8_ = in_R8[3];
  auVar227._8_8_ = 0;
  auVar227._0_8_ = dVar1 + dVar1;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = (dVar2 + dVar2) * in_R8[4];
  auVar14 = vfmadd231sd_fma(auVar371,auVar533,auVar227);
  dVar3 = in_RSI[5];
  auVar942._8_8_ = 0;
  auVar942._0_8_ = in_R8[5];
  auVar838._8_8_ = 0;
  auVar838._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar838,auVar942,auVar14);
  dVar4 = in_RSI[9];
  auVar372._8_8_ = 0;
  auVar372._0_8_ = dVar4;
  auVar1100._8_8_ = 0;
  auVar1100._0_8_ = in_R8[9];
  auVar1022._8_8_ = 0;
  auVar1022._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1022,auVar1100,auVar14);
  dVar4 = in_RSI[10];
  auVar839._8_8_ = 0;
  auVar839._0_8_ = dVar4;
  auVar1164._8_8_ = 0;
  auVar1164._0_8_ = in_R8[10];
  auVar1142._8_8_ = 0;
  auVar1142._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1142,auVar1164,auVar14);
  dVar4 = in_RSI[0xb];
  auVar1023._8_8_ = 0;
  auVar1023._0_8_ = dVar4;
  auVar1190._8_8_ = 0;
  auVar1190._0_8_ = in_R8[0xb];
  auVar1180._8_8_ = 0;
  auVar1180._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1180,auVar1190,auVar14);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar49,auVar1100,auVar14);
  auVar534._8_8_ = 0;
  auVar534._0_8_ = in_R8[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar534,auVar372,auVar14);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar50,auVar1164,auVar14);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = in_R8[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar117,auVar839,auVar14);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar51,auVar1190,auVar14);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = in_R8[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar118,auVar1023,auVar14);
  *(long *)(ctx + 0x19e8) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar535._8_8_ = 0;
  auVar535._0_8_ = in_RCX[3];
  auVar228._8_8_ = 0;
  auVar228._0_8_ = dVar1 + dVar1;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = (dVar2 + dVar2) * in_RCX[4];
  auVar14 = vfmadd231sd_fma(auVar373,auVar535,auVar228);
  dVar3 = in_RSI[5];
  auVar943._8_8_ = 0;
  auVar943._0_8_ = in_RCX[5];
  auVar840._8_8_ = 0;
  auVar840._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar840,auVar943,auVar14);
  dVar4 = in_RSI[9];
  auVar374._8_8_ = 0;
  auVar374._0_8_ = dVar4;
  auVar1101._8_8_ = 0;
  auVar1101._0_8_ = in_RCX[9];
  auVar1024._8_8_ = 0;
  auVar1024._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1024,auVar1101,auVar14);
  dVar4 = in_RSI[10];
  auVar841._8_8_ = 0;
  auVar841._0_8_ = dVar4;
  auVar1165._8_8_ = 0;
  auVar1165._0_8_ = in_RCX[10];
  auVar1143._8_8_ = 0;
  auVar1143._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1143,auVar1165,auVar14);
  dVar4 = in_RSI[0xb];
  auVar1025._8_8_ = 0;
  auVar1025._0_8_ = dVar4;
  auVar1191._8_8_ = 0;
  auVar1191._0_8_ = in_RCX[0xb];
  auVar1181._8_8_ = 0;
  auVar1181._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1181,auVar1191,auVar14);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar52,auVar1101,auVar14);
  auVar536._8_8_ = 0;
  auVar536._0_8_ = in_RCX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar536,auVar374,auVar14);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar53,auVar1165,auVar14);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = in_RCX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar119,auVar841,auVar14);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar54,auVar1191,auVar14);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = in_RCX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar120,auVar1025,auVar14);
  *(long *)(ctx + 0x1ab0) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar537._8_8_ = 0;
  auVar537._0_8_ = in_RDX[3];
  auVar229._8_8_ = 0;
  auVar229._0_8_ = dVar1 + dVar1;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = (dVar2 + dVar2) * in_RDX[4];
  auVar14 = vfmadd231sd_fma(auVar375,auVar537,auVar229);
  dVar3 = in_RSI[5];
  auVar944._8_8_ = 0;
  auVar944._0_8_ = in_RDX[5];
  auVar842._8_8_ = 0;
  auVar842._0_8_ = dVar3 + dVar3;
  auVar14 = vfmadd213sd_fma(auVar842,auVar944,auVar14);
  dVar4 = in_RSI[9];
  auVar376._8_8_ = 0;
  auVar376._0_8_ = dVar4;
  auVar1102._8_8_ = 0;
  auVar1102._0_8_ = in_RDX[9];
  auVar1026._8_8_ = 0;
  auVar1026._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1026,auVar1102,auVar14);
  dVar4 = in_RSI[10];
  auVar843._8_8_ = 0;
  auVar843._0_8_ = dVar4;
  auVar1166._8_8_ = 0;
  auVar1166._0_8_ = in_RDX[10];
  auVar1144._8_8_ = 0;
  auVar1144._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1144,auVar1166,auVar14);
  dVar4 = in_RSI[0xb];
  auVar1027._8_8_ = 0;
  auVar1027._0_8_ = dVar4;
  auVar1192._8_8_ = 0;
  auVar1192._0_8_ = in_RDX[0xb];
  auVar1182._8_8_ = 0;
  auVar1182._0_8_ = dVar4 + dVar4;
  auVar14 = vfmadd213sd_fma(auVar1182,auVar1192,auVar14);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar55,auVar1102,auVar14);
  auVar538._8_8_ = 0;
  auVar538._0_8_ = in_RDX[3] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar538,auVar376,auVar14);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar56,auVar1166,auVar14);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = in_RDX[4] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar121,auVar843,auVar14);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar57,auVar1192,auVar14);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = in_RDX[5] * -2.0;
  auVar14 = vfmadd213sd_fma(auVar122,auVar1027,auVar14);
  *(long *)(ctx + 0x1b78) = auVar14._0_8_;
  dVar1 = in_RSI[3];
  dVar2 = in_RSI[4];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar12 * dVar12 + auVar13._0_8_ * auVar13._0_8_ + auVar13._8_8_ * auVar13._8_8_;
  auVar14 = vsqrtsd_avx(auVar14,auVar14);
  dVar3 = in_RSI[5];
  dVar4 = in_RSI[9];
  auVar377._8_8_ = 0;
  auVar377._0_8_ = dVar4;
  dVar5 = in_RSI[10];
  auVar539._8_8_ = 0;
  auVar539._0_8_ = dVar5;
  dVar6 = in_RSI[0xb];
  auVar676._8_8_ = 0;
  auVar676._0_8_ = dVar6;
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       dVar6 * dVar6 +
       (dVar1 * dVar1 - auVar14._0_8_ * auVar14._0_8_) + dVar2 * dVar2 + dVar3 * dVar3 +
       dVar4 * dVar4 + dVar5 * dVar5;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar1 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar58,auVar377,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar16,auVar539,auVar14);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar3 * -2.0;
  auVar14 = vfmadd213sd_fma(auVar13,auVar676,auVar14);
  *(long *)(ctx + 0x1c40) = auVar14._0_8_;
  return (int)in_stack_00000020;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::init(
    Eigen::Matrix<double,25,37> & groebnerMatrix,
    const Eigen::Matrix<double,12,1> & a,
    Eigen::Matrix<double,12,1> & n,
    Eigen::Matrix<double,12,1> & m,
    Eigen::Matrix<double,12,1> & k,
    Eigen::Matrix<double,12,1> & l,
    Eigen::Vector3d & c0,
    Eigen::Vector3d & c1,
    Eigen::Vector3d & c2,
    Eigen::Vector3d & c3 )
{
  Eigen::Vector3d temp = c0-c1;
  double c01w = temp.norm()*temp.norm();
  temp = c0-c2;
  double c02w = temp.norm()*temp.norm();
  temp = c0-c3;
  double c03w = temp.norm()*temp.norm();
  temp = c1-c2;
  double c12w = temp.norm()*temp.norm();
  temp = c1-c3;
  double c13w = temp.norm()*temp.norm();

  groebnerMatrix(0,22) = ((((((((-2*l(0,0)*l(3,0)-2*l(1,0)*l(4,0))-2*l(2,0)*l(5,0))+pow(l(0,0),2))+pow(l(3,0),2))+pow(l(1,0),2))+pow(l(4,0),2))+pow(l(2,0),2))+pow(l(5,0),2));
  groebnerMatrix(0,23) = (((((((((((2*k(0,0)*l(0,0)-2*k(0,0)*l(3,0))-2*l(0,0)*k(3,0))+2*k(3,0)*l(3,0))+2*k(1,0)*l(1,0))-2*k(1,0)*l(4,0))-2*l(1,0)*k(4,0))+2*k(4,0)*l(4,0))+2*k(2,0)*l(2,0))-2*k(2,0)*l(5,0))-2*l(2,0)*k(5,0))+2*k(5,0)*l(5,0));
  groebnerMatrix(0,24) = ((((((((-2*k(0,0)*k(3,0)-2*k(1,0)*k(4,0))-2*k(2,0)*k(5,0))+pow(k(0,0),2))+pow(k(3,0),2))+pow(k(1,0),2))+pow(k(4,0),2))+pow(k(2,0),2))+pow(k(5,0),2));
  groebnerMatrix(0,25) = (((((((((((2*m(2,0)*l(2,0)+2*m(0,0)*l(0,0))-2*m(0,0)*l(3,0))-2*l(0,0)*m(3,0))+2*m(3,0)*l(3,0))+2*m(1,0)*l(1,0))-2*m(1,0)*l(4,0))-2*l(1,0)*m(4,0))+2*m(4,0)*l(4,0))-2*m(2,0)*l(5,0))-2*l(2,0)*m(5,0))+2*m(5,0)*l(5,0));
  groebnerMatrix(0,26) = (((((((((((2*m(2,0)*k(2,0)+2*m(0,0)*k(0,0))-2*m(0,0)*k(3,0))-2*k(0,0)*m(3,0))+2*m(3,0)*k(3,0))+2*m(1,0)*k(1,0))-2*m(1,0)*k(4,0))-2*k(1,0)*m(4,0))+2*m(4,0)*k(4,0))-2*m(2,0)*k(5,0))-2*k(2,0)*m(5,0))+2*m(5,0)*k(5,0));
  groebnerMatrix(0,27) = ((((((((-2*m(0,0)*m(3,0)-2*m(1,0)*m(4,0))-2*m(2,0)*m(5,0))+pow(m(0,0),2))+pow(m(3,0),2))+pow(m(1,0),2))+pow(m(4,0),2))+pow(m(2,0),2))+pow(m(5,0),2));
  groebnerMatrix(0,28) = (((((((((((2*n(0,0)*l(0,0)-2*n(0,0)*l(3,0))-2*l(0,0)*n(3,0))+2*n(3,0)*l(3,0))+2*n(1,0)*l(1,0))-2*n(1,0)*l(4,0))-2*l(1,0)*n(4,0))+2*n(4,0)*l(4,0))+2*n(2,0)*l(2,0))-2*n(2,0)*l(5,0))-2*l(2,0)*n(5,0))+2*n(5,0)*l(5,0));
  groebnerMatrix(0,29) = (((((((((((2*n(0,0)*k(0,0)-2*n(0,0)*k(3,0))-2*k(0,0)*n(3,0))+2*n(3,0)*k(3,0))+2*n(1,0)*k(1,0))-2*n(1,0)*k(4,0))-2*k(1,0)*n(4,0))+2*n(4,0)*k(4,0))+2*n(2,0)*k(2,0))-2*n(2,0)*k(5,0))-2*k(2,0)*n(5,0))+2*n(5,0)*k(5,0));
  groebnerMatrix(0,30) = (((((((((((2*n(0,0)*m(0,0)-2*n(0,0)*m(3,0))-2*m(0,0)*n(3,0))+2*n(3,0)*m(3,0))+2*n(1,0)*m(1,0))-2*n(1,0)*m(4,0))-2*m(1,0)*n(4,0))+2*n(4,0)*m(4,0))+2*n(2,0)*m(2,0))-2*n(2,0)*m(5,0))-2*m(2,0)*n(5,0))+2*n(5,0)*m(5,0));
  groebnerMatrix(0,31) = ((((((((-2*n(0,0)*n(3,0)-2*n(1,0)*n(4,0))-2*n(2,0)*n(5,0))+pow(n(0,0),2))+pow(n(3,0),2))+pow(n(1,0),2))+pow(n(4,0),2))+pow(n(2,0),2))+pow(n(5,0),2));
  groebnerMatrix(0,32) = (((((((((((2*a(0,0)*l(0,0)-2*a(0,0)*l(3,0))-2*l(0,0)*a(3,0))+2*a(3,0)*l(3,0))+2*a(1,0)*l(1,0))-2*a(1,0)*l(4,0))-2*l(1,0)*a(4,0))+2*a(4,0)*l(4,0))+2*a(2,0)*l(2,0))-2*a(2,0)*l(5,0))-2*l(2,0)*a(5,0))+2*a(5,0)*l(5,0));
  groebnerMatrix(0,33) = (((((((((((2*a(0,0)*k(0,0)-2*a(0,0)*k(3,0))-2*k(0,0)*a(3,0))+2*a(3,0)*k(3,0))+2*a(1,0)*k(1,0))-2*a(1,0)*k(4,0))-2*k(1,0)*a(4,0))+2*a(4,0)*k(4,0))+2*a(2,0)*k(2,0))-2*a(2,0)*k(5,0))-2*k(2,0)*a(5,0))+2*a(5,0)*k(5,0));
  groebnerMatrix(0,34) = (((((((((((2*a(0,0)*m(0,0)-2*a(0,0)*m(3,0))-2*m(0,0)*a(3,0))+2*a(3,0)*m(3,0))+2*a(1,0)*m(1,0))-2*a(1,0)*m(4,0))-2*m(1,0)*a(4,0))+2*a(4,0)*m(4,0))+2*a(2,0)*m(2,0))-2*a(2,0)*m(5,0))-2*m(2,0)*a(5,0))+2*a(5,0)*m(5,0));
  groebnerMatrix(0,35) = (((((((((((2*a(0,0)*n(0,0)-2*a(0,0)*n(3,0))-2*n(0,0)*a(3,0))+2*a(3,0)*n(3,0))+2*a(1,0)*n(1,0))-2*a(1,0)*n(4,0))-2*n(1,0)*a(4,0))+2*a(4,0)*n(4,0))+2*a(2,0)*n(2,0))-2*a(2,0)*n(5,0))-2*n(2,0)*a(5,0))+2*a(5,0)*n(5,0));
  groebnerMatrix(0,36) = (((((((((-c01w+pow(a(0,0),2))-2*a(0,0)*a(3,0))+pow(a(3,0),2))+pow(a(1,0),2))-2*a(1,0)*a(4,0))+pow(a(4,0),2))+pow(a(2,0),2))-2*a(2,0)*a(5,0))+pow(a(5,0),2));
  groebnerMatrix(1,22) = ((((((((-2*l(0,0)*l(6,0)-2*l(1,0)*l(7,0))-2*l(2,0)*l(8,0))+pow(l(0,0),2))+pow(l(1,0),2))+pow(l(2,0),2))+pow(l(6,0),2))+pow(l(7,0),2))+pow(l(8,0),2));
  groebnerMatrix(1,23) = (((((((((((2*k(0,0)*l(0,0)+2*k(1,0)*l(1,0))+2*k(2,0)*l(2,0))-2*k(0,0)*l(6,0))-2*l(0,0)*k(6,0))+2*k(6,0)*l(6,0))-2*k(1,0)*l(7,0))-2*l(1,0)*k(7,0))+2*k(7,0)*l(7,0))-2*k(2,0)*l(8,0))-2*l(2,0)*k(8,0))+2*k(8,0)*l(8,0));
  groebnerMatrix(1,24) = ((((((((-2*k(0,0)*k(6,0)-2*k(1,0)*k(7,0))-2*k(2,0)*k(8,0))+pow(k(0,0),2))+pow(k(1,0),2))+pow(k(2,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2));
  groebnerMatrix(1,25) = (((((((((((2*m(2,0)*l(2,0)+2*m(0,0)*l(0,0))+2*m(1,0)*l(1,0))-2*m(0,0)*l(6,0))-2*l(0,0)*m(6,0))+2*m(6,0)*l(6,0))-2*m(1,0)*l(7,0))-2*l(1,0)*m(7,0))+2*m(7,0)*l(7,0))-2*m(2,0)*l(8,0))-2*l(2,0)*m(8,0))+2*m(8,0)*l(8,0));
  groebnerMatrix(1,26) = (((((((((((2*m(2,0)*k(2,0)+2*m(0,0)*k(0,0))+2*m(1,0)*k(1,0))-2*m(0,0)*k(6,0))-2*k(0,0)*m(6,0))+2*m(6,0)*k(6,0))-2*m(1,0)*k(7,0))-2*k(1,0)*m(7,0))+2*m(7,0)*k(7,0))-2*m(2,0)*k(8,0))-2*k(2,0)*m(8,0))+2*m(8,0)*k(8,0));
  groebnerMatrix(1,27) = ((((((((-2*m(0,0)*m(6,0)-2*m(1,0)*m(7,0))-2*m(2,0)*m(8,0))+pow(m(0,0),2))+pow(m(1,0),2))+pow(m(2,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2));
  groebnerMatrix(1,28) = (((((((((((2*n(0,0)*l(0,0)+2*n(1,0)*l(1,0))+2*n(2,0)*l(2,0))-2*n(0,0)*l(6,0))-2*l(0,0)*n(6,0))+2*n(6,0)*l(6,0))-2*n(1,0)*l(7,0))-2*l(1,0)*n(7,0))+2*n(7,0)*l(7,0))-2*n(2,0)*l(8,0))-2*l(2,0)*n(8,0))+2*n(8,0)*l(8,0));
  groebnerMatrix(1,29) = (((((((((((2*n(0,0)*k(0,0)+2*n(1,0)*k(1,0))+2*n(2,0)*k(2,0))-2*n(0,0)*k(6,0))-2*k(0,0)*n(6,0))+2*n(6,0)*k(6,0))-2*n(1,0)*k(7,0))-2*k(1,0)*n(7,0))+2*n(7,0)*k(7,0))-2*n(2,0)*k(8,0))-2*k(2,0)*n(8,0))+2*n(8,0)*k(8,0));
  groebnerMatrix(1,30) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(6,0))-2*m(0,0)*n(6,0))+2*n(6,0)*m(6,0))-2*n(1,0)*m(7,0))-2*m(1,0)*n(7,0))+2*n(7,0)*m(7,0))-2*n(2,0)*m(8,0))-2*m(2,0)*n(8,0))+2*n(8,0)*m(8,0));
  groebnerMatrix(1,31) = ((((((((-2*n(0,0)*n(6,0)-2*n(1,0)*n(7,0))-2*n(2,0)*n(8,0))+pow(n(0,0),2))+pow(n(1,0),2))+pow(n(2,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2));
  groebnerMatrix(1,32) = (((((((((((-2*a(0,0)*l(6,0)+2*a(0,0)*l(0,0))+2*a(1,0)*l(1,0))+2*a(2,0)*l(2,0))-2*l(0,0)*a(6,0))+2*a(6,0)*l(6,0))-2*a(1,0)*l(7,0))-2*l(1,0)*a(7,0))+2*a(7,0)*l(7,0))-2*a(2,0)*l(8,0))-2*l(2,0)*a(8,0))+2*a(8,0)*l(8,0));
  groebnerMatrix(1,33) = (((((((((((-2*a(0,0)*k(6,0)+2*a(0,0)*k(0,0))+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))-2*k(0,0)*a(6,0))+2*a(6,0)*k(6,0))-2*a(1,0)*k(7,0))-2*k(1,0)*a(7,0))+2*a(7,0)*k(7,0))-2*a(2,0)*k(8,0))-2*k(2,0)*a(8,0))+2*a(8,0)*k(8,0));
  groebnerMatrix(1,34) = (((((((((((-2*a(0,0)*m(6,0)-2*m(0,0)*a(6,0))+2*a(0,0)*m(0,0))+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))+2*a(6,0)*m(6,0))-2*a(1,0)*m(7,0))-2*m(1,0)*a(7,0))+2*a(7,0)*m(7,0))-2*a(2,0)*m(8,0))-2*m(2,0)*a(8,0))+2*a(8,0)*m(8,0));
  groebnerMatrix(1,35) = (((((((((((-2*a(0,0)*n(6,0)-2*n(0,0)*a(6,0))+2*a(0,0)*n(0,0))+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))+2*a(6,0)*n(6,0))-2*a(1,0)*n(7,0))-2*n(1,0)*a(7,0))+2*a(7,0)*n(7,0))-2*a(2,0)*n(8,0))-2*n(2,0)*a(8,0))+2*a(8,0)*n(8,0));
  groebnerMatrix(1,36) = (((((((((-c02w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(6,0))+pow(a(6,0),2))-2*a(1,0)*a(7,0))+pow(a(7,0),2))-2*a(2,0)*a(8,0))+pow(a(8,0),2));
  groebnerMatrix(2,22) = ((((((((pow(l(0,0),2)+pow(l(1,0),2))+pow(l(2,0),2))-2*l(0,0)*l(9,0))-2*l(1,0)*l(10,0))-2*l(2,0)*l(11,0))+pow(l(9,0),2))+pow(l(10,0),2))+pow(l(11,0),2));
  groebnerMatrix(2,23) = (((((((((((2*k(0,0)*l(0,0)+2*k(1,0)*l(1,0))+2*k(2,0)*l(2,0))-2*k(0,0)*l(9,0))-2*l(0,0)*k(9,0))+2*k(9,0)*l(9,0))-2*k(1,0)*l(10,0))-2*l(1,0)*k(10,0))+2*k(10,0)*l(10,0))-2*k(2,0)*l(11,0))-2*l(2,0)*k(11,0))+2*k(11,0)*l(11,0));
  groebnerMatrix(2,24) = ((((((((pow(k(0,0),2)+pow(k(1,0),2))+pow(k(2,0),2))-2*k(0,0)*k(9,0))-2*k(1,0)*k(10,0))-2*k(2,0)*k(11,0))+pow(k(9,0),2))+pow(k(10,0),2))+pow(k(11,0),2));
  groebnerMatrix(2,25) = (((((((((((2*m(2,0)*l(2,0)+2*m(0,0)*l(0,0))+2*m(1,0)*l(1,0))-2*m(0,0)*l(9,0))-2*l(0,0)*m(9,0))+2*m(9,0)*l(9,0))-2*m(1,0)*l(10,0))-2*l(1,0)*m(10,0))+2*m(10,0)*l(10,0))-2*m(2,0)*l(11,0))-2*l(2,0)*m(11,0))+2*m(11,0)*l(11,0));
  groebnerMatrix(2,26) = (((((((((((2*m(2,0)*k(2,0)+2*m(0,0)*k(0,0))+2*m(1,0)*k(1,0))-2*m(0,0)*k(9,0))-2*k(0,0)*m(9,0))+2*m(9,0)*k(9,0))-2*m(1,0)*k(10,0))-2*k(1,0)*m(10,0))+2*m(10,0)*k(10,0))-2*m(2,0)*k(11,0))-2*k(2,0)*m(11,0))+2*m(11,0)*k(11,0));
  groebnerMatrix(2,27) = ((((((((pow(m(0,0),2)+pow(m(1,0),2))+pow(m(2,0),2))-2*m(0,0)*m(9,0))-2*m(1,0)*m(10,0))-2*m(2,0)*m(11,0))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(2,28) = (((((((((((2*n(0,0)*l(0,0)+2*n(1,0)*l(1,0))+2*n(2,0)*l(2,0))-2*n(0,0)*l(9,0))-2*l(0,0)*n(9,0))+2*n(9,0)*l(9,0))-2*n(1,0)*l(10,0))-2*l(1,0)*n(10,0))+2*n(10,0)*l(10,0))-2*n(2,0)*l(11,0))-2*l(2,0)*n(11,0))+2*n(11,0)*l(11,0));
  groebnerMatrix(2,29) = (((((((((((2*n(0,0)*k(0,0)+2*n(1,0)*k(1,0))+2*n(2,0)*k(2,0))-2*n(0,0)*k(9,0))-2*k(0,0)*n(9,0))+2*n(9,0)*k(9,0))-2*n(1,0)*k(10,0))-2*k(1,0)*n(10,0))+2*n(10,0)*k(10,0))-2*n(2,0)*k(11,0))-2*k(2,0)*n(11,0))+2*n(11,0)*k(11,0));
  groebnerMatrix(2,30) = (((((((((((2*n(0,0)*m(0,0)+2*n(1,0)*m(1,0))+2*n(2,0)*m(2,0))-2*n(0,0)*m(9,0))-2*m(0,0)*n(9,0))+2*n(9,0)*m(9,0))-2*n(1,0)*m(10,0))-2*m(1,0)*n(10,0))+2*n(10,0)*m(10,0))-2*n(2,0)*m(11,0))-2*m(2,0)*n(11,0))+2*n(11,0)*m(11,0));
  groebnerMatrix(2,31) = ((((((((pow(n(0,0),2)+pow(n(1,0),2))+pow(n(2,0),2))-2*n(0,0)*n(9,0))-2*n(1,0)*n(10,0))-2*n(2,0)*n(11,0))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(2,32) = (((((((((((2*a(0,0)*l(0,0)+2*a(1,0)*l(1,0))+2*a(2,0)*l(2,0))-2*a(0,0)*l(9,0))-2*l(0,0)*a(9,0))+2*a(9,0)*l(9,0))-2*a(1,0)*l(10,0))-2*l(1,0)*a(10,0))+2*a(10,0)*l(10,0))-2*a(2,0)*l(11,0))-2*l(2,0)*a(11,0))+2*a(11,0)*l(11,0));
  groebnerMatrix(2,33) = (((((((((((2*a(0,0)*k(0,0)+2*a(1,0)*k(1,0))+2*a(2,0)*k(2,0))-2*a(0,0)*k(9,0))-2*k(0,0)*a(9,0))+2*a(9,0)*k(9,0))-2*a(1,0)*k(10,0))-2*k(1,0)*a(10,0))+2*a(10,0)*k(10,0))-2*a(2,0)*k(11,0))-2*k(2,0)*a(11,0))+2*a(11,0)*k(11,0));
  groebnerMatrix(2,34) = (((((((((((2*a(0,0)*m(0,0)+2*a(1,0)*m(1,0))+2*a(2,0)*m(2,0))-2*a(0,0)*m(9,0))-2*m(0,0)*a(9,0))+2*a(9,0)*m(9,0))-2*a(1,0)*m(10,0))-2*m(1,0)*a(10,0))+2*a(10,0)*m(10,0))-2*a(2,0)*m(11,0))-2*m(2,0)*a(11,0))+2*a(11,0)*m(11,0));
  groebnerMatrix(2,35) = (((((((((((2*a(0,0)*n(0,0)+2*a(1,0)*n(1,0))+2*a(2,0)*n(2,0))-2*a(0,0)*n(9,0))-2*n(0,0)*a(9,0))+2*a(9,0)*n(9,0))-2*a(1,0)*n(10,0))-2*n(1,0)*a(10,0))+2*a(10,0)*n(10,0))-2*a(2,0)*n(11,0))-2*n(2,0)*a(11,0))+2*a(11,0)*n(11,0));
  groebnerMatrix(2,36) = (((((((((-c03w+pow(a(0,0),2))+pow(a(1,0),2))+pow(a(2,0),2))-2*a(0,0)*a(9,0))+pow(a(9,0),2))-2*a(1,0)*a(10,0))+pow(a(10,0),2))-2*a(2,0)*a(11,0))+pow(a(11,0),2));
  groebnerMatrix(3,22) = ((((((((pow(l(3,0),2)+pow(l(4,0),2))+pow(l(5,0),2))+pow(l(6,0),2))+pow(l(7,0),2))+pow(l(8,0),2))-2*l(3,0)*l(6,0))-2*l(4,0)*l(7,0))-2*l(5,0)*l(8,0));
  groebnerMatrix(3,23) = (((((((((((2*k(3,0)*l(3,0)+2*k(4,0)*l(4,0))-2*k(4,0)*l(7,0))-2*l(4,0)*k(7,0))+2*k(5,0)*l(5,0))+2*k(6,0)*l(6,0))+2*k(7,0)*l(7,0))+2*k(8,0)*l(8,0))-2*k(3,0)*l(6,0))-2*l(3,0)*k(6,0))-2*k(5,0)*l(8,0))-2*l(5,0)*k(8,0));
  groebnerMatrix(3,24) = ((((((((pow(k(3,0),2)+pow(k(4,0),2))+pow(k(5,0),2))+pow(k(6,0),2))+pow(k(7,0),2))+pow(k(8,0),2))-2*k(3,0)*k(6,0))-2*k(4,0)*k(7,0))-2*k(5,0)*k(8,0));
  groebnerMatrix(3,25) = (((((((((((2*m(3,0)*l(3,0)+2*m(4,0)*l(4,0))-2*m(4,0)*l(7,0))-2*l(4,0)*m(7,0))+2*m(5,0)*l(5,0))+2*m(6,0)*l(6,0))+2*m(7,0)*l(7,0))+2*m(8,0)*l(8,0))-2*m(3,0)*l(6,0))-2*l(3,0)*m(6,0))-2*m(5,0)*l(8,0))-2*l(5,0)*m(8,0));
  groebnerMatrix(3,26) = (((((((((((2*m(3,0)*k(3,0)+2*m(4,0)*k(4,0))-2*m(4,0)*k(7,0))-2*k(4,0)*m(7,0))+2*m(5,0)*k(5,0))+2*m(6,0)*k(6,0))+2*m(7,0)*k(7,0))+2*m(8,0)*k(8,0))-2*m(3,0)*k(6,0))-2*k(3,0)*m(6,0))-2*m(5,0)*k(8,0))-2*k(5,0)*m(8,0));
  groebnerMatrix(3,27) = ((((((((pow(m(3,0),2)+pow(m(4,0),2))+pow(m(5,0),2))+pow(m(6,0),2))+pow(m(7,0),2))+pow(m(8,0),2))-2*m(3,0)*m(6,0))-2*m(4,0)*m(7,0))-2*m(5,0)*m(8,0));
  groebnerMatrix(3,28) = (((((((((((2*n(3,0)*l(3,0)+2*n(4,0)*l(4,0))-2*l(4,0)*n(7,0))+2*n(5,0)*l(5,0))+2*n(6,0)*l(6,0))+2*n(7,0)*l(7,0))+2*n(8,0)*l(8,0))-2*n(3,0)*l(6,0))-2*l(3,0)*n(6,0))-2*n(4,0)*l(7,0))-2*n(5,0)*l(8,0))-2*l(5,0)*n(8,0));
  groebnerMatrix(3,29) = (((((((((((2*n(3,0)*k(3,0)+2*n(4,0)*k(4,0))-2*k(4,0)*n(7,0))+2*n(5,0)*k(5,0))+2*n(6,0)*k(6,0))+2*n(7,0)*k(7,0))+2*n(8,0)*k(8,0))-2*n(3,0)*k(6,0))-2*k(3,0)*n(6,0))-2*n(4,0)*k(7,0))-2*n(5,0)*k(8,0))-2*k(5,0)*n(8,0));
  groebnerMatrix(3,30) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))-2*m(4,0)*n(7,0))+2*n(5,0)*m(5,0))+2*n(6,0)*m(6,0))+2*n(7,0)*m(7,0))+2*n(8,0)*m(8,0))-2*n(3,0)*m(6,0))-2*m(3,0)*n(6,0))-2*n(4,0)*m(7,0))-2*n(5,0)*m(8,0))-2*m(5,0)*n(8,0));
  groebnerMatrix(3,31) = ((((((((-2*n(3,0)*n(6,0)+pow(n(3,0),2))+pow(n(4,0),2))+pow(n(5,0),2))+pow(n(6,0),2))+pow(n(7,0),2))+pow(n(8,0),2))-2*n(4,0)*n(7,0))-2*n(5,0)*n(8,0));
  groebnerMatrix(3,32) = (((((((((((-2*a(3,0)*l(6,0)+2*a(3,0)*l(3,0))+2*a(4,0)*l(4,0))+2*a(5,0)*l(5,0))+2*a(6,0)*l(6,0))+2*a(7,0)*l(7,0))+2*a(8,0)*l(8,0))-2*l(3,0)*a(6,0))-2*a(4,0)*l(7,0))-2*l(4,0)*a(7,0))-2*a(5,0)*l(8,0))-2*l(5,0)*a(8,0));
  groebnerMatrix(3,33) = (((((((((((-2*a(3,0)*k(6,0)+2*a(3,0)*k(3,0))+2*a(4,0)*k(4,0))+2*a(5,0)*k(5,0))+2*a(6,0)*k(6,0))+2*a(7,0)*k(7,0))+2*a(8,0)*k(8,0))-2*k(3,0)*a(6,0))-2*a(4,0)*k(7,0))-2*k(4,0)*a(7,0))-2*a(5,0)*k(8,0))-2*k(5,0)*a(8,0));
  groebnerMatrix(3,34) = (((((((((((-2*a(3,0)*m(6,0)+2*a(3,0)*m(3,0))+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(6,0)*m(6,0))+2*a(7,0)*m(7,0))+2*a(8,0)*m(8,0))-2*m(3,0)*a(6,0))-2*a(4,0)*m(7,0))-2*m(4,0)*a(7,0))-2*a(5,0)*m(8,0))-2*m(5,0)*a(8,0));
  groebnerMatrix(3,35) = (((((((((((-2*n(3,0)*a(6,0)-2*a(3,0)*n(6,0))+2*a(3,0)*n(3,0))+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(6,0)*n(6,0))+2*a(7,0)*n(7,0))+2*a(8,0)*n(8,0))-2*a(4,0)*n(7,0))-2*n(4,0)*a(7,0))-2*a(5,0)*n(8,0))-2*n(5,0)*a(8,0));
  groebnerMatrix(3,36) = (((((((((-c12w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(6,0),2))+pow(a(7,0),2))+pow(a(8,0),2))-2*a(3,0)*a(6,0))-2*a(4,0)*a(7,0))-2*a(5,0)*a(8,0));
  groebnerMatrix(4,22) = ((((((((pow(l(3,0),2)+pow(l(4,0),2))+pow(l(5,0),2))-2*l(3,0)*l(9,0))-2*l(4,0)*l(10,0))-2*l(5,0)*l(11,0))+pow(l(9,0),2))+pow(l(10,0),2))+pow(l(11,0),2));
  groebnerMatrix(4,23) = (((((((((((2*k(3,0)*l(3,0)+2*k(4,0)*l(4,0))+2*k(5,0)*l(5,0))+2*k(9,0)*l(9,0))+2*k(10,0)*l(10,0))+2*k(11,0)*l(11,0))-2*k(3,0)*l(9,0))-2*l(3,0)*k(9,0))-2*k(4,0)*l(10,0))-2*l(4,0)*k(10,0))-2*k(5,0)*l(11,0))-2*l(5,0)*k(11,0));
  groebnerMatrix(4,24) = ((((((((pow(k(3,0),2)+pow(k(4,0),2))+pow(k(5,0),2))-2*k(3,0)*k(9,0))-2*k(4,0)*k(10,0))-2*k(5,0)*k(11,0))+pow(k(9,0),2))+pow(k(10,0),2))+pow(k(11,0),2));
  groebnerMatrix(4,25) = (((((((((((2*m(3,0)*l(3,0)+2*m(4,0)*l(4,0))+2*m(5,0)*l(5,0))+2*m(9,0)*l(9,0))+2*m(10,0)*l(10,0))+2*m(11,0)*l(11,0))-2*m(3,0)*l(9,0))-2*l(3,0)*m(9,0))-2*m(4,0)*l(10,0))-2*l(4,0)*m(10,0))-2*m(5,0)*l(11,0))-2*l(5,0)*m(11,0));
  groebnerMatrix(4,26) = (((((((((((2*m(3,0)*k(3,0)+2*m(4,0)*k(4,0))+2*m(5,0)*k(5,0))+2*m(9,0)*k(9,0))+2*m(10,0)*k(10,0))+2*m(11,0)*k(11,0))-2*m(3,0)*k(9,0))-2*k(3,0)*m(9,0))-2*m(4,0)*k(10,0))-2*k(4,0)*m(10,0))-2*m(5,0)*k(11,0))-2*k(5,0)*m(11,0));
  groebnerMatrix(4,27) = ((((((((pow(m(3,0),2)+pow(m(4,0),2))+pow(m(5,0),2))-2*m(3,0)*m(9,0))-2*m(4,0)*m(10,0))-2*m(5,0)*m(11,0))+pow(m(9,0),2))+pow(m(10,0),2))+pow(m(11,0),2));
  groebnerMatrix(4,28) = (((((((((((2*n(3,0)*l(3,0)+2*n(4,0)*l(4,0))+2*n(5,0)*l(5,0))+2*n(9,0)*l(9,0))+2*n(10,0)*l(10,0))+2*n(11,0)*l(11,0))-2*n(3,0)*l(9,0))-2*l(3,0)*n(9,0))-2*n(4,0)*l(10,0))-2*l(4,0)*n(10,0))-2*n(5,0)*l(11,0))-2*l(5,0)*n(11,0));
  groebnerMatrix(4,29) = (((((((((((2*n(3,0)*k(3,0)+2*n(4,0)*k(4,0))+2*n(5,0)*k(5,0))+2*n(9,0)*k(9,0))+2*n(10,0)*k(10,0))+2*n(11,0)*k(11,0))-2*n(3,0)*k(9,0))-2*k(3,0)*n(9,0))-2*n(4,0)*k(10,0))-2*k(4,0)*n(10,0))-2*n(5,0)*k(11,0))-2*k(5,0)*n(11,0));
  groebnerMatrix(4,30) = (((((((((((2*n(3,0)*m(3,0)+2*n(4,0)*m(4,0))+2*n(5,0)*m(5,0))+2*n(9,0)*m(9,0))+2*n(10,0)*m(10,0))+2*n(11,0)*m(11,0))-2*n(3,0)*m(9,0))-2*m(3,0)*n(9,0))-2*n(4,0)*m(10,0))-2*m(4,0)*n(10,0))-2*n(5,0)*m(11,0))-2*m(5,0)*n(11,0));
  groebnerMatrix(4,31) = ((((((((pow(n(3,0),2)+pow(n(4,0),2))+pow(n(5,0),2))-2*n(3,0)*n(9,0))-2*n(4,0)*n(10,0))-2*n(5,0)*n(11,0))+pow(n(9,0),2))+pow(n(10,0),2))+pow(n(11,0),2));
  groebnerMatrix(4,32) = (((((((((((2*a(3,0)*l(3,0)+2*a(4,0)*l(4,0))+2*a(5,0)*l(5,0))+2*a(9,0)*l(9,0))+2*a(10,0)*l(10,0))+2*a(11,0)*l(11,0))-2*a(3,0)*l(9,0))-2*l(3,0)*a(9,0))-2*a(4,0)*l(10,0))-2*l(4,0)*a(10,0))-2*a(5,0)*l(11,0))-2*l(5,0)*a(11,0));
  groebnerMatrix(4,33) = (((((((((((2*a(3,0)*k(3,0)+2*a(4,0)*k(4,0))+2*a(5,0)*k(5,0))+2*a(9,0)*k(9,0))+2*a(10,0)*k(10,0))+2*a(11,0)*k(11,0))-2*a(3,0)*k(9,0))-2*k(3,0)*a(9,0))-2*a(4,0)*k(10,0))-2*k(4,0)*a(10,0))-2*a(5,0)*k(11,0))-2*k(5,0)*a(11,0));
  groebnerMatrix(4,34) = (((((((((((2*a(3,0)*m(3,0)+2*a(4,0)*m(4,0))+2*a(5,0)*m(5,0))+2*a(9,0)*m(9,0))+2*a(10,0)*m(10,0))+2*a(11,0)*m(11,0))-2*a(3,0)*m(9,0))-2*m(3,0)*a(9,0))-2*a(4,0)*m(10,0))-2*m(4,0)*a(10,0))-2*a(5,0)*m(11,0))-2*m(5,0)*a(11,0));
  groebnerMatrix(4,35) = (((((((((((2*a(3,0)*n(3,0)+2*a(4,0)*n(4,0))+2*a(5,0)*n(5,0))+2*a(9,0)*n(9,0))+2*a(10,0)*n(10,0))+2*a(11,0)*n(11,0))-2*a(3,0)*n(9,0))-2*n(3,0)*a(9,0))-2*a(4,0)*n(10,0))-2*n(4,0)*a(10,0))-2*a(5,0)*n(11,0))-2*n(5,0)*a(11,0));
  groebnerMatrix(4,36) = (((((((((-c13w+pow(a(3,0),2))+pow(a(4,0),2))+pow(a(5,0),2))+pow(a(9,0),2))+pow(a(10,0),2))+pow(a(11,0),2))-2*a(3,0)*a(9,0))-2*a(4,0)*a(10,0))-2*a(5,0)*a(11,0));
}